

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalForcesContIntDamping
          (ChElementShellANCF_3833 *this,ChVectorDynamic<> *Fi)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  undefined1 auVar4 [16];
  pointer pLVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ChKblockGeneric *pCVar80;
  ChVectorDynamic<> *pCVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  pointer psVar106;
  pointer psVar107;
  pointer psVar108;
  pointer pLVar109;
  pointer pLVar110;
  ulong uVar111;
  void *pvVar112;
  undefined8 *puVar113;
  double *pdVar114;
  char *__function;
  double dVar115;
  ulong uVar116;
  ChElementShellANCF_3833 *pCVar117;
  ChElementShellANCF_3833 *this_00;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  double dVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  VectorNIP E_BlockDamping;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  VectorNIP E3_Block;
  VectorNIP E1_Block;
  VectorNIP E4_Block;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_1_Block;
  VectorNIP E2_Block;
  ChMatrixNM<double,_6,_6> D;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  MatrixNx3 QiCompact;
  MatrixNx6 ebar_ebardot;
  undefined1 local_2140 [16];
  undefined1 local_2130 [32];
  undefined1 local_2110 [16];
  undefined1 local_2100 [16];
  undefined1 local_20f0 [16];
  undefined1 local_20e0 [32];
  undefined1 local_20c0 [8];
  double dStack_20b8;
  undefined1 local_20b0 [16];
  undefined1 local_20a0 [16];
  undefined1 local_2090 [16];
  undefined1 local_2080 [16];
  undefined1 local_2070 [16];
  undefined1 local_2060 [16];
  undefined1 local_2050 [16];
  double local_2040;
  double dStack_2038;
  double local_2030 [4];
  double local_2010;
  double dStack_2008;
  double local_2000;
  double dStack_1ff8;
  double local_1ff0;
  double dStack_1fe8;
  double local_1fe0;
  double dStack_1fd8;
  double local_1fd0;
  double dStack_1fc8;
  double local_1fc0;
  double dStack_1fb8;
  double local_1fb0;
  double dStack_1fa8;
  double local_1fa0 [4];
  double local_1f80;
  double dStack_1f78;
  double local_1f70;
  double dStack_1f68;
  double local_1f60;
  double dStack_1f58;
  double local_1f50;
  double dStack_1f48;
  double local_1f40;
  double dStack_1f38;
  double local_1f30;
  double dStack_1f28;
  double local_1f20;
  double dStack_1f18;
  double local_1f10 [4];
  double local_1ef0;
  double dStack_1ee8;
  double local_1ee0;
  double dStack_1ed8;
  double local_1ed0;
  double dStack_1ec8;
  double local_1ec0;
  double dStack_1eb8;
  double local_1eb0;
  double dStack_1ea8;
  double local_1ea0;
  double dStack_1e98;
  ulong local_1e88;
  double local_1e80;
  double dStack_1e78;
  double local_1e70 [4];
  double local_1e50;
  double dStack_1e48;
  double local_1e40;
  double dStack_1e38;
  double local_1e30;
  double dStack_1e28;
  double local_1e20;
  double dStack_1e18;
  double local_1e10;
  double dStack_1e08;
  double local_1e00;
  double dStack_1df8;
  undefined1 local_1df0 [16];
  double local_1de0;
  double dStack_1dd8;
  double local_1dd0;
  double dStack_1dc8;
  undefined1 local_1dc0 [16];
  undefined1 local_1db0 [16];
  undefined1 local_1da0 [16];
  undefined1 local_1d90 [16];
  double local_1d80;
  double dStack_1d78;
  ChVectorDynamic<> *local_1d68;
  long local_1d60;
  long local_1d58;
  double local_1d50;
  Scalar local_1d48;
  double local_1d40;
  double dStack_1d38;
  double local_1d30 [4];
  double local_1d10;
  double dStack_1d08;
  double local_1d00;
  double dStack_1cf8;
  double local_1cf0;
  double dStack_1ce8;
  undefined1 local_1ce0 [16];
  undefined1 local_1cd0 [16];
  double local_1cc0;
  double dStack_1cb8;
  undefined1 local_1cb0 [16];
  undefined1 local_1ca0 [16];
  undefined1 local_1c90 [16];
  undefined1 local_1c80 [16];
  double local_1c70;
  double dStack_1c68;
  double local_1c60;
  double dStack_1c58;
  undefined1 local_1c50 [16];
  undefined1 local_1c40 [16];
  undefined1 local_1c30 [16];
  double local_1c20;
  double dStack_1c18;
  double local_1c10 [4];
  double local_1bf0;
  double dStack_1be8;
  double local_1be0;
  double dStack_1bd8;
  double local_1bd0;
  double dStack_1bc8;
  double local_1bc0;
  double dStack_1bb8;
  double local_1bb0;
  double dStack_1ba8;
  double local_1ba0;
  double dStack_1b98;
  double local_1b90;
  double dStack_1b88;
  double local_1b80 [4];
  double local_1b60;
  double dStack_1b58;
  double local_1b50;
  double dStack_1b48;
  double local_1b40;
  double dStack_1b38;
  undefined1 local_1b30 [16];
  undefined1 local_1b20 [16];
  undefined1 local_1b10 [16];
  undefined1 local_1b00 [1360];
  undefined1 local_15b0 [16];
  double local_15a0;
  double dStack_1598;
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  double local_1570;
  double dStack_1568;
  double local_1560;
  double dStack_1558;
  undefined1 local_1550 [16];
  undefined1 local_1540 [16];
  double local_1530;
  double dStack_1528;
  double local_1520;
  double dStack_1518;
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  double local_14e0;
  double dStack_14d8;
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  double local_14b0;
  double dStack_14a8;
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  double local_1480;
  double dStack_1478;
  undefined1 local_1470 [16];
  double local_1460;
  double dStack_1458;
  double local_1450;
  double dStack_1448;
  double local_1440;
  double dStack_1438;
  double local_1430 [2];
  undefined1 local_1420 [16];
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  double local_13c0;
  double dStack_13b8;
  double local_13b0;
  double dStack_13a8;
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  double local_1380;
  double dStack_1378;
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  double local_1330;
  double dStack_1328;
  undefined1 local_1320 [16];
  double local_1310 [4];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  double local_12d0;
  double dStack_12c8;
  undefined1 local_12c0 [16];
  double local_12b0;
  double dStack_12a8;
  undefined1 local_12a0 [16];
  double local_1290;
  double dStack_1288;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  double local_1220;
  double dStack_1218;
  double local_1210;
  double dStack_1208;
  double local_1200;
  double dStack_11f8;
  undefined1 local_11f0 [16];
  double local_11e0;
  double dStack_11d8;
  double local_11d0;
  double dStack_11c8;
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  double local_1180;
  double dStack_1178;
  undefined1 local_1170 [16];
  double local_1160 [4];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  double local_1110;
  double dStack_1108;
  double local_1100;
  double dStack_10f8;
  undefined1 local_10f0 [16];
  double local_10e0;
  double dStack_10d8;
  double local_10d0 [4];
  double local_10b0;
  double dStack_10a8;
  double local_10a0;
  double dStack_1098;
  double local_1090;
  double dStack_1088;
  double local_1080;
  double dStack_1078;
  double local_1070;
  double dStack_1068;
  double local_1060;
  double dStack_1058;
  double local_1050;
  double dStack_1048;
  double local_1040 [4];
  double local_1020;
  double dStack_1018;
  double local_1010;
  double dStack_1008;
  double local_1000;
  double dStack_ff8;
  double local_ff0;
  double dStack_fe8;
  double local_fe0;
  double dStack_fd8;
  double local_fd0;
  double dStack_fc8;
  double local_fc0;
  double dStack_fb8;
  double local_fb0 [4];
  double local_f90;
  double dStack_f88;
  double local_f80;
  double dStack_f78;
  double local_f70;
  double dStack_f68;
  double local_f60;
  double dStack_f58;
  double local_f50;
  double dStack_f48;
  double local_f40;
  double dStack_f38;
  double local_f30;
  double dStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  double local_f10;
  double dStack_f08;
  double local_f00 [4];
  double local_ee0;
  double dStack_ed8;
  double local_ed0;
  double dStack_ec8;
  double local_ec0;
  double dStack_eb8;
  double local_eb0;
  double dStack_ea8;
  double local_ea0;
  double dStack_e98;
  double local_e90;
  double dStack_e88;
  undefined1 local_e80 [96];
  pointer local_e20;
  pointer local_e18;
  pointer local_e10;
  pointer local_e08;
  pointer local_e00;
  pointer local_df8;
  pointer local_df0;
  pointer local_de8;
  pointer local_de0;
  double local_dd8;
  double local_dd0;
  double local_dc8;
  double local_dc0;
  double local_db8;
  double local_db0;
  double local_da8;
  double local_da0;
  double local_d98;
  double local_d90;
  double local_d88;
  double local_d80;
  double local_d78;
  double local_d70;
  double local_d68;
  double local_d40;
  double dStack_d38;
  double local_ce0;
  double dStack_cd8;
  double local_ca0;
  double dStack_c98;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false> local_c88;
  Matrix<double,_54,_3,_0,_54,_3> *local_c58;
  Matrix<double,_54,_3,_0,_54,_3> local_c50;
  Matrix<double,_24,_3,_1,_24,_3> local_740;
  MatrixNx6 local_500;
  
  local_1d68 = Fi;
  CalcCombinedCoordMatrix(this,&local_500);
  memset(&local_740,0,0x240);
  if (this->m_numLayers != 0) {
    uVar111 = 0;
    local_f20 = 0xbff0000000000000;
    uStack_f18 = 0xbff0000000000000;
    local_f30 = 0.5;
    dStack_f28 = 0.5;
    do {
      dVar115 = (double)(uVar111 * 0x36);
      local_1e88 = uVar111;
      if (((long)dVar115 < 0) ||
         ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x18)) {
LAB_00761cf2:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 24, 54>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 24, BlockCols = 54, InnerPanel = false]"
        ;
LAB_00761d07:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      dVar144 = (double)(this->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols;
      local_1d58 = (long)dVar115 + 0x36;
      if ((long)dVar144 < local_1d58) goto LAB_00761cf2;
      local_1d60 = uVar111 * 0x1b0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = (double)((this->m_SD).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                          .m_data + uVar111 * 0x36);
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[3] = 0.0;
      local_1d50 = dVar115;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[2] = (double)&this->m_SD;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[4] = dVar115;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[5] = dVar144;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[6] = (double)&local_500;
      memset((Matrix<double,_54,_6,_0,_54,_6> *)local_1b00,0,0xa20);
      local_e80._0_8_ = (_func_int **)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,24,54,false>>,Eigen::Matrix<double,24,6,1,24,6>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,54,6,0,54,6>>
                ((Matrix<double,_54,_6,_0,_54,_6> *)local_1b00,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false>_>
                  *)&local_c50,&local_500,(Scalar *)local_e80);
      uVar105 = local_1b00._1288_8_;
      uVar104 = local_1b00._1280_8_;
      uVar103 = local_1b00._1256_8_;
      uVar102 = local_1b00._1248_8_;
      uVar101 = local_1b00._1208_8_;
      uVar100 = local_1b00._1200_8_;
      uVar99 = local_1b00._1192_8_;
      uVar98 = local_1b00._1184_8_;
      uVar97 = local_1b00._824_8_;
      uVar96 = local_1b00._816_8_;
      uVar95 = local_1b00._808_8_;
      uVar94 = local_1b00._800_8_;
      uVar93 = local_1b00._760_8_;
      uVar92 = local_1b00._752_8_;
      uVar91 = local_1b00._744_8_;
      uVar90 = local_1b00._736_8_;
      uVar89 = local_1b00._408_8_;
      uVar88 = local_1b00._400_8_;
      uVar87 = local_1b00._392_8_;
      uVar86 = local_1b00._384_8_;
      uVar85 = local_1b00._344_8_;
      uVar84 = local_1b00._336_8_;
      uVar83 = local_1b00._328_8_;
      uVar82 = local_1b00._320_8_;
      uVar111 = local_1e88;
      local_20e0._8_8_ =
           (double)local_1b00._8_8_ * (double)local_1b00._1304_8_ +
           (double)local_1b00._440_8_ * dStack_1438 + (double)local_1b00._872_8_ * dStack_1288;
      local_20e0._0_8_ =
           (double)local_1b00._0_8_ * (double)local_1b00._1296_8_ +
           (double)local_1b00._432_8_ * local_1440 + (double)local_1b00._864_8_ * local_1290;
      auVar127._8_8_ = local_1b00._888_8_;
      auVar127._0_8_ = local_1b00._880_8_;
      auVar118 = vmulpd_avx512vl(auVar127,local_1280);
      local_20f0._8_8_ =
           (double)local_1b00._24_8_ * (double)local_1b00._1320_8_ +
           (double)local_1b00._456_8_ * local_1430[1] + auVar118._8_8_;
      local_20f0._0_8_ =
           (double)local_1b00._16_8_ * (double)local_1b00._1312_8_ +
           (double)local_1b00._448_8_ * local_1430[0] + auVar118._0_8_;
      auVar128._8_8_ = local_1b00._472_8_;
      auVar128._0_8_ = local_1b00._464_8_;
      auVar118 = vmulpd_avx512vl(auVar128,local_1420);
      auVar131._8_8_ = local_1b00._904_8_;
      auVar131._0_8_ = local_1b00._896_8_;
      auVar119 = vmulpd_avx512vl(auVar131,local_1270);
      local_2100._8_8_ =
           (double)local_1b00._40_8_ * (double)local_1b00._1336_8_ + auVar118._8_8_ + auVar119._8_8_
      ;
      local_2100._0_8_ =
           (double)local_1b00._32_8_ * (double)local_1b00._1328_8_ + auVar118._0_8_ + auVar119._0_8_
      ;
      auVar118._8_8_ = local_1b00._56_8_;
      auVar118._0_8_ = local_1b00._48_8_;
      auVar119._8_8_ = local_1b00._72_8_;
      auVar119._0_8_ = local_1b00._64_8_;
      auVar129._8_8_ = local_1b00._488_8_;
      auVar129._0_8_ = local_1b00._480_8_;
      auVar120 = vmulpd_avx512vl(auVar118,local_1b00._1344_16_);
      auVar121 = vmulpd_avx512vl(auVar129,local_1410);
      auVar132._8_8_ = local_1b00._920_8_;
      auVar132._0_8_ = local_1b00._912_8_;
      auVar122 = vmulpd_avx512vl(auVar132,local_1260);
      local_2110._8_8_ = auVar120._8_8_ + auVar121._8_8_ + auVar122._8_8_;
      local_2110._0_8_ = auVar120._0_8_ + auVar121._0_8_ + auVar122._0_8_;
      auVar120 = vmulpd_avx512vl(auVar119,local_15b0);
      auVar122._8_8_ = local_1b00._504_8_;
      auVar122._0_8_ = local_1b00._496_8_;
      auVar121 = vmulpd_avx512vl(auVar122,local_1400);
      auVar133._8_8_ = local_1b00._936_8_;
      auVar133._0_8_ = local_1b00._928_8_;
      auVar123 = vmulpd_avx512vl(auVar133,local_1250);
      local_2090._0_8_ = auVar120._0_8_ + auVar121._0_8_ + auVar123._0_8_;
      local_2090._8_8_ = auVar120._8_8_ + auVar121._8_8_ + auVar123._8_8_;
      auVar123._8_8_ = local_1b00._520_8_;
      auVar123._0_8_ = local_1b00._512_8_;
      auVar120 = vmulpd_avx512vl(auVar123,local_13f0);
      auVar134._8_8_ = local_1b00._952_8_;
      auVar134._0_8_ = local_1b00._944_8_;
      auVar121 = vmulpd_avx512vl(auVar134,local_1240);
      local_2080._0_8_ = (double)local_1b00._80_8_ * local_15a0 + auVar120._0_8_ + auVar121._0_8_;
      local_2080._8_8_ = (double)local_1b00._88_8_ * dStack_1598 + auVar120._8_8_ + auVar121._8_8_;
      auVar120._8_8_ = local_1b00._104_8_;
      auVar120._0_8_ = local_1b00._96_8_;
      auVar121._8_8_ = local_1b00._120_8_;
      auVar121._0_8_ = local_1b00._112_8_;
      auVar130._8_8_ = local_1b00._536_8_;
      auVar130._0_8_ = local_1b00._528_8_;
      auVar124 = vmulpd_avx512vl(auVar120,local_1590);
      auVar125 = vmulpd_avx512vl(auVar130,local_13e0);
      auVar135._8_8_ = local_1b00._968_8_;
      auVar135._0_8_ = local_1b00._960_8_;
      auVar126 = vmulpd_avx512vl(auVar135,local_1230);
      local_2070._0_8_ = auVar126._0_8_ + auVar125._0_8_ + auVar124._0_8_;
      local_2070._8_8_ = auVar126._8_8_ + auVar125._8_8_ + auVar124._8_8_;
      auVar125 = vmulpd_avx512vl(auVar121,local_1580);
      auVar124._8_8_ = local_1b00._552_8_;
      auVar124._0_8_ = local_1b00._544_8_;
      auVar126 = vmulpd_avx512vl(auVar124,local_13d0);
      local_2060._0_8_ = auVar125._0_8_ + auVar126._0_8_ + (double)local_1b00._976_8_ * local_1220;
      local_2060._8_8_ = auVar125._8_8_ + auVar126._8_8_ + (double)local_1b00._984_8_ * dStack_1218;
      local_2050._0_8_ =
           (double)local_1b00._992_8_ * local_1210 +
           (double)local_1b00._128_8_ * local_1570 + (double)local_1b00._560_8_ * local_13c0;
      local_2050._8_8_ =
           (double)local_1b00._1000_8_ * dStack_1208 +
           (double)local_1b00._136_8_ * dStack_1568 + (double)local_1b00._568_8_ * dStack_13b8;
      auVar137._0_8_ =
           (double)local_1b00._864_8_ * (double)local_1b00._864_8_ +
           (double)local_1b00._432_8_ * (double)local_1b00._432_8_ +
           (double)local_1b00._0_8_ * (double)local_1b00._0_8_;
      auVar137._8_8_ =
           (double)local_1b00._872_8_ * (double)local_1b00._872_8_ +
           (double)local_1b00._440_8_ * (double)local_1b00._440_8_ +
           (double)local_1b00._8_8_ * (double)local_1b00._8_8_;
      auVar127 = vmulpd_avx512vl(auVar127,auVar127);
      auVar138._0_8_ =
           (double)local_1b00._16_8_ * (double)local_1b00._16_8_ +
           (double)local_1b00._448_8_ * (double)local_1b00._448_8_ + auVar127._0_8_;
      auVar138._8_8_ =
           (double)local_1b00._24_8_ * (double)local_1b00._24_8_ +
           (double)local_1b00._456_8_ * (double)local_1b00._456_8_ + auVar127._8_8_;
      auVar128 = vmulpd_avx512vl(auVar128,auVar128);
      auVar127 = vmulpd_avx512vl(auVar131,auVar131);
      auVar139._0_8_ =
           (double)local_1b00._32_8_ * (double)local_1b00._32_8_ + auVar128._0_8_ + auVar127._0_8_;
      auVar139._8_8_ =
           (double)local_1b00._40_8_ * (double)local_1b00._40_8_ + auVar128._8_8_ + auVar127._8_8_;
      auVar118 = vmulpd_avx512vl(auVar118,auVar118);
      auVar128 = vmulpd_avx512vl(auVar129,auVar129);
      auVar129 = vmulpd_avx512vl(auVar132,auVar132);
      auVar140._0_8_ = auVar118._0_8_ + auVar128._0_8_ + auVar129._0_8_;
      auVar140._8_8_ = auVar118._8_8_ + auVar128._8_8_ + auVar129._8_8_;
      auVar118 = vmulpd_avx512vl(auVar119,auVar119);
      auVar119 = vmulpd_avx512vl(auVar122,auVar122);
      auVar128 = vmulpd_avx512vl(auVar133,auVar133);
      auVar142._0_8_ = auVar118._0_8_ + auVar119._0_8_ + auVar128._0_8_;
      auVar142._8_8_ = auVar118._8_8_ + auVar119._8_8_ + auVar128._8_8_;
      auVar118 = vmulpd_avx512vl(auVar123,auVar123);
      auVar119 = vmulpd_avx512vl(auVar134,auVar134);
      auVar143._0_8_ =
           (double)local_1b00._80_8_ * (double)local_1b00._80_8_ + auVar118._0_8_ + auVar119._0_8_;
      auVar143._8_8_ =
           (double)local_1b00._88_8_ * (double)local_1b00._88_8_ + auVar118._8_8_ + auVar119._8_8_;
      auVar118 = vmulpd_avx512vl(auVar120,auVar120);
      auVar119 = vmulpd_avx512vl(auVar130,auVar130);
      auVar118 = vaddpd_avx512vl(auVar118,auVar119);
      auVar119 = vmulpd_avx512vl(auVar135,auVar135);
      auVar118 = vaddpd_avx512vl(auVar118,auVar119);
      auVar119 = vmulpd_avx512vl(auVar121,auVar121);
      auVar120 = vmulpd_avx512vl(auVar124,auVar124);
      auVar119 = vaddpd_avx512vl(auVar119,auVar120);
      auVar136._0_8_ = (double)local_1b00._976_8_ * (double)local_1b00._976_8_;
      auVar136._8_8_ = (double)local_1b00._984_8_ * (double)local_1b00._984_8_;
      auVar119 = vaddpd_avx512vl(auVar119,auVar136);
      _local_20c0 = local_20f0;
      local_20b0 = local_2100;
      local_20a0 = local_2110;
      auVar126._0_8_ =
           (double)local_1b00._128_8_ * (double)local_1b00._128_8_ +
           (double)local_1b00._560_8_ * (double)local_1b00._560_8_ +
           (double)local_1b00._992_8_ * (double)local_1b00._992_8_;
      auVar126._8_8_ =
           (double)local_1b00._136_8_ * (double)local_1b00._136_8_ +
           (double)local_1b00._568_8_ * (double)local_1b00._568_8_ +
           (double)local_1b00._1000_8_ * (double)local_1b00._1000_8_;
      auVar125._8_8_ = uStack_f18;
      auVar125._0_8_ = local_f20;
      auVar120 = vaddpd_avx512vl(auVar137,auVar125);
      auVar121 = vaddpd_avx512vl(auVar138,auVar125);
      auVar128 = vaddpd_avx512vl(auVar139,auVar125);
      auVar129 = vaddpd_avx512vl(auVar140,auVar125);
      auVar122 = vaddpd_avx512vl(auVar142,auVar125);
      auVar123 = vaddpd_avx512vl(auVar143,auVar125);
      auVar118 = vaddpd_avx512vl(auVar118,auVar125);
      auVar119 = vaddpd_avx512vl(auVar119,auVar125);
      auVar130 = vaddpd_avx512vl(auVar126,auVar125);
      dVar115 = this->m_Alpha;
      auVar141._8_8_ = dVar115;
      auVar141._0_8_ = dVar115;
      auVar124 = vmulpd_avx512vl(local_20e0._0_16_,auVar141);
      local_1c20 = local_f30 * auVar120._0_8_ + auVar124._0_8_;
      dStack_1c18 = dStack_f28 * auVar120._8_8_ + auVar124._8_8_;
      auVar120 = vmulpd_avx512vl(local_20f0,auVar141);
      local_1c10[0] = local_f30 * auVar121._0_8_ + auVar120._0_8_;
      local_1c10[1] = dStack_f28 * auVar121._8_8_ + auVar120._8_8_;
      auVar120 = vmulpd_avx512vl(local_2100,auVar141);
      local_1c10[2] = local_f30 * auVar128._0_8_ + auVar120._0_8_;
      local_1c10[3] = dStack_f28 * auVar128._8_8_ + auVar120._8_8_;
      auVar120 = vmulpd_avx512vl(local_2110,auVar141);
      local_1bf0 = auVar129._0_8_ * local_f30 + auVar120._0_8_;
      dStack_1be8 = auVar129._8_8_ * dStack_f28 + auVar120._8_8_;
      local_1be0 = auVar122._0_8_ * local_f30 + (double)local_2090._0_8_ * dVar115;
      dStack_1bd8 = auVar122._8_8_ * dStack_f28 + (double)local_2090._8_8_ * dVar115;
      local_1bd0 = auVar123._0_8_ * local_f30 + (double)local_2080._0_8_ * dVar115;
      dStack_1bc8 = auVar123._8_8_ * dStack_f28 + (double)local_2080._8_8_ * dVar115;
      local_1bc0 = auVar118._0_8_ * local_f30 + (double)local_2070._0_8_ * dVar115;
      dStack_1bb8 = auVar118._8_8_ * dStack_f28 + (double)local_2070._8_8_ * dVar115;
      local_1bb0 = local_f30 * auVar119._0_8_ + (double)local_2060._0_8_ * dVar115;
      dStack_1ba8 = dStack_f28 * auVar119._8_8_ + (double)local_2060._8_8_ * dVar115;
      local_1ba0 = local_f30 * auVar130._0_8_ + (double)local_2050._0_8_ * dVar115;
      dStack_1b98 = dStack_f28 * auVar130._8_8_ + (double)local_2050._8_8_ * dVar115;
      lVar1 = local_1e88 * 0x12 + 0x12;
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < lVar1) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) {
LAB_00761cdb:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 18, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 18, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00761d07;
      }
      pdVar114 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_1c20 = local_1c20 * pdVar114[local_1e88 * 0x12];
      dStack_1c18 = dStack_1c18 * (pdVar114 + local_1e88 * 0x12)[1];
      local_1c10[0] = local_1c10[0] * pdVar114[local_1e88 * 0x12 + 2];
      local_1c10[1] = local_1c10[1] * (pdVar114 + local_1e88 * 0x12 + 2)[1];
      local_1c10[2] = local_1c10[2] * pdVar114[local_1e88 * 0x12 + 4];
      local_1c10[3] = local_1c10[3] * (pdVar114 + local_1e88 * 0x12 + 4)[1];
      local_1bf0 = local_1bf0 * pdVar114[local_1e88 * 0x12 + 6];
      dStack_1be8 = dStack_1be8 * (pdVar114 + local_1e88 * 0x12 + 6)[1];
      local_1be0 = local_1be0 * pdVar114[local_1e88 * 0x12 + 8];
      dStack_1bd8 = dStack_1bd8 * (pdVar114 + local_1e88 * 0x12 + 8)[1];
      local_1bd0 = local_1bd0 * pdVar114[local_1e88 * 0x12 + 10];
      dStack_1bc8 = dStack_1bc8 * (pdVar114 + local_1e88 * 0x12 + 10)[1];
      local_1bc0 = local_1bc0 * pdVar114[local_1e88 * 0x12 + 0xc];
      dStack_1bb8 = dStack_1bb8 * (pdVar114 + local_1e88 * 0x12 + 0xc)[1];
      local_1bb0 = local_1bb0 * pdVar114[local_1e88 * 0x12 + 0xe];
      dStack_1ba8 = dStack_1ba8 * (pdVar114 + local_1e88 * 0x12 + 0xe)[1];
      local_1ba0 = local_1ba0 * pdVar114[local_1e88 * 0x12 + 0x10];
      dStack_1b98 = dStack_1b98 * (pdVar114 + local_1e88 * 0x12 + 0x10)[1];
      local_20e0._8_8_ =
           (double)local_1b00._152_8_ * dStack_1558 + (double)local_1b00._584_8_ * dStack_13a8 +
           (double)local_1b00._1016_8_ * dStack_11f8;
      local_20e0._0_8_ =
           (double)local_1b00._144_8_ * local_1560 + (double)local_1b00._576_8_ * local_13b0 +
           (double)local_1b00._1008_8_ * local_1200;
      auVar22._8_8_ = local_1b00._168_8_;
      auVar22._0_8_ = local_1b00._160_8_;
      auVar43._8_8_ = local_1b00._600_8_;
      auVar43._0_8_ = local_1b00._592_8_;
      auVar118 = vmulpd_avx512vl(auVar22,local_1550);
      auVar119 = vmulpd_avx512vl(auVar43,local_13a0);
      auVar61._8_8_ = local_1b00._1032_8_;
      auVar61._0_8_ = local_1b00._1024_8_;
      auVar120 = vmulpd_avx512vl(auVar61,local_11f0);
      local_20f0._8_8_ = auVar118._8_8_ + auVar119._8_8_ + auVar120._8_8_;
      local_20f0._0_8_ = auVar118._0_8_ + auVar119._0_8_ + auVar120._0_8_;
      auVar24._8_8_ = local_1b00._184_8_;
      auVar24._0_8_ = local_1b00._176_8_;
      auVar45._8_8_ = local_1b00._616_8_;
      auVar45._0_8_ = local_1b00._608_8_;
      auVar118 = vmulpd_avx512vl(auVar24,local_1540);
      auVar119 = vmulpd_avx512vl(auVar45,local_1390);
      local_1d90._8_8_ = auVar118._8_8_ + auVar119._8_8_ + (double)local_1b00._1048_8_ * dStack_11d8
      ;
      local_1d90._0_8_ = auVar118._0_8_ + auVar119._0_8_ + (double)local_1b00._1040_8_ * local_11e0;
      local_2130._8_8_ =
           (double)local_1b00._200_8_ * dStack_1528 + (double)local_1b00._632_8_ * dStack_1378 +
           (double)local_1b00._1064_8_ * dStack_11c8;
      local_2130._0_8_ =
           (double)local_1b00._192_8_ * local_1530 + (double)local_1b00._624_8_ * local_1380 +
           (double)local_1b00._1056_8_ * local_11d0;
      auVar47._8_8_ = local_1b00._648_8_;
      auVar47._0_8_ = local_1b00._640_8_;
      auVar118 = vmulpd_avx512vl(auVar47,local_1370);
      auVar63._8_8_ = local_1b00._1080_8_;
      auVar63._0_8_ = local_1b00._1072_8_;
      auVar119 = vmulpd_avx512vl(auVar63,local_11c0);
      auVar26._8_8_ = local_1b00._232_8_;
      auVar26._0_8_ = local_1b00._224_8_;
      auVar49._8_8_ = local_1b00._664_8_;
      auVar49._0_8_ = local_1b00._656_8_;
      auVar120 = vmulpd_avx512vl(auVar26,local_1510);
      auVar121 = vmulpd_avx512vl(auVar49,local_1360);
      auVar65._8_8_ = local_1b00._1096_8_;
      auVar65._0_8_ = local_1b00._1088_8_;
      auVar128 = vmulpd_avx512vl(auVar65,local_11b0);
      auVar28._8_8_ = local_1b00._248_8_;
      auVar28._0_8_ = local_1b00._240_8_;
      auVar50._8_8_ = local_1b00._680_8_;
      auVar50._0_8_ = local_1b00._672_8_;
      auVar129 = vmulpd_avx512vl(auVar28,local_1500);
      auVar122 = vmulpd_avx512vl(auVar50,local_1350);
      auVar67._8_8_ = local_1b00._1112_8_;
      auVar67._0_8_ = local_1b00._1104_8_;
      auVar123 = vmulpd_avx512vl(auVar67,local_11a0);
      auVar29._8_8_ = local_1b00._264_8_;
      auVar29._0_8_ = local_1b00._256_8_;
      auVar51._8_8_ = local_1b00._696_8_;
      auVar51._0_8_ = local_1b00._688_8_;
      auVar130 = vmulpd_avx512vl(auVar29,local_14f0);
      auVar124 = vmulpd_avx512vl(auVar51,local_1340);
      auVar68._8_8_ = local_1b00._1128_8_;
      auVar68._0_8_ = local_1b00._1120_8_;
      auVar127 = vmulpd_avx512vl(auVar68,local_1190);
      auVar150._0_8_ =
           (double)local_1b00._1008_8_ * (double)local_1b00._1008_8_ +
           (double)local_1b00._576_8_ * (double)local_1b00._576_8_ +
           (double)local_1b00._144_8_ * (double)local_1b00._144_8_;
      auVar150._8_8_ =
           (double)local_1b00._1016_8_ * (double)local_1b00._1016_8_ +
           (double)local_1b00._584_8_ * (double)local_1b00._584_8_ +
           (double)local_1b00._152_8_ * (double)local_1b00._152_8_;
      auVar131 = vmulpd_avx512vl(auVar22,auVar22);
      auVar132 = vmulpd_avx512vl(auVar43,auVar43);
      auVar133 = vmulpd_avx512vl(auVar61,auVar61);
      auVar160._0_8_ = auVar131._0_8_ + auVar132._0_8_ + auVar133._0_8_;
      auVar160._8_8_ = auVar131._8_8_ + auVar132._8_8_ + auVar133._8_8_;
      auVar131 = vmulpd_avx512vl(auVar24,auVar24);
      auVar132 = vmulpd_avx512vl(auVar45,auVar45);
      auVar161._0_8_ =
           auVar131._0_8_ + auVar132._0_8_ +
           (double)local_1b00._1040_8_ * (double)local_1b00._1040_8_;
      auVar161._8_8_ =
           auVar131._8_8_ + auVar132._8_8_ +
           (double)local_1b00._1048_8_ * (double)local_1b00._1048_8_;
      auVar163._0_8_ =
           (double)local_1b00._192_8_ * (double)local_1b00._192_8_ +
           (double)local_1b00._624_8_ * (double)local_1b00._624_8_ +
           (double)local_1b00._1056_8_ * (double)local_1b00._1056_8_;
      auVar163._8_8_ =
           (double)local_1b00._200_8_ * (double)local_1b00._200_8_ +
           (double)local_1b00._632_8_ * (double)local_1b00._632_8_ +
           (double)local_1b00._1064_8_ * (double)local_1b00._1064_8_;
      auVar131 = vmulpd_avx512vl(auVar47,auVar47);
      auVar132 = vmulpd_avx512vl(auVar63,auVar63);
      auVar165._0_8_ =
           (double)local_1b00._208_8_ * (double)local_1b00._208_8_ + auVar131._0_8_ + auVar132._0_8_
      ;
      auVar165._8_8_ =
           (double)local_1b00._216_8_ * (double)local_1b00._216_8_ + auVar131._8_8_ + auVar132._8_8_
      ;
      auVar131 = vmulpd_avx512vl(auVar26,auVar26);
      auVar132 = vmulpd_avx512vl(auVar49,auVar49);
      auVar133 = vmulpd_avx512vl(auVar65,auVar65);
      auVar166._0_8_ = auVar131._0_8_ + auVar132._0_8_ + auVar133._0_8_;
      auVar166._8_8_ = auVar131._8_8_ + auVar132._8_8_ + auVar133._8_8_;
      auVar131 = vmulpd_avx512vl(auVar28,auVar28);
      auVar132 = vmulpd_avx512vl(auVar50,auVar50);
      auVar131 = vaddpd_avx512vl(auVar131,auVar132);
      auVar132 = vmulpd_avx512vl(auVar67,auVar67);
      auVar131 = vaddpd_avx512vl(auVar131,auVar132);
      auVar132 = vmulpd_avx512vl(auVar29,auVar29);
      auVar133 = vmulpd_avx512vl(auVar51,auVar51);
      auVar132 = vaddpd_avx512vl(auVar132,auVar133);
      auVar133 = vmulpd_avx512vl(auVar68,auVar68);
      auVar146._0_8_ = auVar132._0_8_ + auVar133._0_8_;
      auVar146._8_8_ = auVar132._8_8_ + auVar133._8_8_;
      auVar145._0_8_ =
           (double)local_1b00._272_8_ * (double)local_1b00._272_8_ +
           (double)local_1b00._704_8_ * (double)local_1b00._704_8_ +
           (double)local_1b00._1136_8_ * (double)local_1b00._1136_8_;
      auVar145._8_8_ =
           (double)local_1b00._280_8_ * (double)local_1b00._280_8_ +
           (double)local_1b00._712_8_ * (double)local_1b00._712_8_ +
           (double)local_1b00._1144_8_ * (double)local_1b00._1144_8_;
      auVar78._8_8_ = uStack_f18;
      auVar78._0_8_ = local_f20;
      auVar132 = vaddpd_avx512vl(auVar150,auVar78);
      auVar133 = vaddpd_avx512vl(auVar160,auVar78);
      auVar134 = vaddpd_avx512vl(auVar161,auVar78);
      auVar135 = vaddpd_avx512vl(auVar163,auVar78);
      auVar125 = vaddpd_avx512vl(auVar165,auVar78);
      auVar126 = vaddpd_avx512vl(auVar166,auVar78);
      auVar131 = vaddpd_avx512vl(auVar131,auVar78);
      auVar136 = vaddpd_avx512vl(auVar146,auVar78);
      auVar137 = vaddpd_avx512vl(auVar145,auVar78);
      auVar77._8_8_ = dStack_f28;
      auVar77._0_8_ = local_f30;
      auVar138 = vmulpd_avx512vl(auVar141,local_20e0._0_16_);
      auVar139 = vmulpd_avx512vl(auVar141,local_20f0);
      auVar140 = vmulpd_avx512vl(auVar141,local_1d90);
      auVar141 = vmulpd_avx512vl(auVar141,local_2130._0_16_);
      local_f10 = (auVar138._0_8_ + local_f30 * auVar132._0_8_) * pdVar114[local_1e88 * 0x12];
      dStack_f08 = (auVar138._8_8_ + dStack_f28 * auVar132._8_8_) *
                   (pdVar114 + local_1e88 * 0x12)[1];
      local_f00[0] = (auVar139._0_8_ + local_f30 * auVar133._0_8_) * pdVar114[local_1e88 * 0x12 + 2]
      ;
      local_f00[1] = (auVar139._8_8_ + dStack_f28 * auVar133._8_8_) *
                     (pdVar114 + local_1e88 * 0x12 + 2)[1];
      local_f00[2] = (auVar140._0_8_ + local_f30 * auVar134._0_8_) * pdVar114[local_1e88 * 0x12 + 4]
      ;
      local_f00[3] = (auVar140._8_8_ + dStack_f28 * auVar134._8_8_) *
                     (pdVar114 + local_1e88 * 0x12 + 4)[1];
      local_ee0 = (auVar135._0_8_ * local_f30 + auVar141._0_8_) * pdVar114[local_1e88 * 0x12 + 6];
      dStack_ed8 = (auVar135._8_8_ * dStack_f28 + auVar141._8_8_) *
                   (pdVar114 + local_1e88 * 0x12 + 6)[1];
      local_ed0 = (auVar125._0_8_ * local_f30 +
                  dVar115 * ((double)local_1b00._208_8_ * local_1520 + auVar118._0_8_ +
                            auVar119._0_8_)) * pdVar114[local_1e88 * 0x12 + 8];
      dStack_ec8 = (auVar125._8_8_ * dStack_f28 +
                   dVar115 * ((double)local_1b00._216_8_ * dStack_1518 + auVar118._8_8_ +
                             auVar119._8_8_)) * (pdVar114 + local_1e88 * 0x12 + 8)[1];
      local_ec0 = (auVar126._0_8_ * local_f30 +
                  dVar115 * (auVar120._0_8_ + auVar121._0_8_ + auVar128._0_8_)) *
                  pdVar114[local_1e88 * 0x12 + 10];
      dStack_eb8 = (auVar126._8_8_ * dStack_f28 +
                   dVar115 * (auVar120._8_8_ + auVar121._8_8_ + auVar128._8_8_)) *
                   (pdVar114 + local_1e88 * 0x12 + 10)[1];
      local_eb0 = (auVar131._0_8_ * local_f30 +
                  dVar115 * (auVar123._0_8_ + auVar122._0_8_ + auVar129._0_8_)) *
                  pdVar114[local_1e88 * 0x12 + 0xc];
      dStack_ea8 = (auVar131._8_8_ * dStack_f28 +
                   dVar115 * (auVar123._8_8_ + auVar122._8_8_ + auVar129._8_8_)) *
                   (pdVar114 + local_1e88 * 0x12 + 0xc)[1];
      local_ea0 = (dVar115 * (auVar130._0_8_ + auVar124._0_8_ + auVar127._0_8_) +
                  local_f30 * auVar136._0_8_) * pdVar114[local_1e88 * 0x12 + 0xe];
      dStack_e98 = (dVar115 * (auVar130._8_8_ + auVar124._8_8_ + auVar127._8_8_) +
                   dStack_f28 * auVar136._8_8_) * (pdVar114 + local_1e88 * 0x12 + 0xe)[1];
      local_e90 = (local_f30 * auVar137._0_8_ +
                  dVar115 * ((double)local_1b00._272_8_ * local_14e0 +
                             (double)local_1b00._704_8_ * local_1330 +
                            (double)local_1b00._1136_8_ * local_1180)) *
                  pdVar114[local_1e88 * 0x12 + 0x10];
      dStack_e88 = (dStack_f28 * auVar137._8_8_ +
                   dVar115 * ((double)local_1b00._280_8_ * dStack_14d8 +
                              (double)local_1b00._712_8_ * dStack_1328 +
                             (double)local_1b00._1144_8_ * dStack_1178)) *
                   (pdVar114 + local_1e88 * 0x12 + 0x10)[1];
      auVar30._8_8_ = local_1b00._296_8_;
      auVar30._0_8_ = local_1b00._288_8_;
      auVar52._8_8_ = local_1b00._728_8_;
      auVar52._0_8_ = local_1b00._720_8_;
      auVar118 = vmulpd_avx512vl(auVar30,local_14d0);
      auVar119 = vmulpd_avx512vl(auVar52,local_1320);
      auVar69._8_8_ = local_1b00._1160_8_;
      auVar69._0_8_ = local_1b00._1152_8_;
      auVar120 = vmulpd_avx512vl(auVar69,local_1170);
      dVar115 = auVar118._0_8_ + auVar119._0_8_ + auVar120._0_8_;
      dVar144 = auVar118._8_8_ + auVar119._8_8_ + auVar120._8_8_;
      local_2130._8_8_ = dVar144;
      local_2130._0_8_ = dVar115;
      auVar118 = local_2130._0_16_;
      auVar31._8_8_ = local_1b00._312_8_;
      auVar31._0_8_ = local_1b00._304_8_;
      auVar119 = vmulpd_avx512vl(auVar31,local_14c0);
      auVar70._8_8_ = local_1b00._1176_8_;
      auVar70._0_8_ = local_1b00._1168_8_;
      local_2140._8_8_ =
           auVar119._8_8_ + (double)local_1b00._744_8_ * local_1310[1] +
           (double)local_1b00._1176_8_ * local_1160[1];
      local_2140._0_8_ =
           auVar119._0_8_ + (double)local_1b00._736_8_ * local_1310[0] +
           (double)local_1b00._1168_8_ * local_1160[0];
      auVar32._8_8_ = local_1b00._328_8_;
      auVar32._0_8_ = local_1b00._320_8_;
      auVar71._8_8_ = local_1b00._1192_8_;
      auVar71._0_8_ = local_1b00._1184_8_;
      local_1dc0._8_8_ =
           (double)local_1b00._328_8_ * dStack_14a8 + (double)local_1b00._760_8_ * local_1310[3] +
           (double)local_1b00._1192_8_ * local_1160[3];
      local_1dc0._0_8_ =
           (double)local_1b00._320_8_ * local_14b0 + (double)local_1b00._752_8_ * local_1310[2] +
           (double)local_1b00._1184_8_ * local_1160[2];
      auVar33._8_8_ = local_1b00._344_8_;
      auVar33._0_8_ = local_1b00._336_8_;
      auVar53._8_8_ = local_1b00._776_8_;
      auVar53._0_8_ = local_1b00._768_8_;
      auVar119 = vmulpd_avx512vl(auVar33,local_14a0);
      auVar120 = vmulpd_avx512vl(auVar53,local_12f0);
      auVar72._8_8_ = local_1b00._1208_8_;
      auVar72._0_8_ = local_1b00._1200_8_;
      auVar121 = vmulpd_avx512vl(auVar72,local_1140);
      local_1dd0 = auVar119._0_8_ + auVar120._0_8_ + auVar121._0_8_;
      dStack_1dc8 = auVar119._8_8_ + auVar120._8_8_ + auVar121._8_8_;
      auVar34._8_8_ = local_1b00._360_8_;
      auVar34._0_8_ = local_1b00._352_8_;
      auVar54._8_8_ = local_1b00._792_8_;
      auVar54._0_8_ = local_1b00._784_8_;
      auVar119 = vmulpd_avx512vl(auVar34,local_1490);
      auVar120 = vmulpd_avx512vl(auVar54,local_12e0);
      auVar73._8_8_ = local_1b00._1224_8_;
      auVar73._0_8_ = local_1b00._1216_8_;
      auVar121 = vmulpd_avx512vl(auVar73,local_1130);
      local_1de0 = auVar119._0_8_ + auVar120._0_8_ + auVar121._0_8_;
      dStack_1dd8 = auVar119._8_8_ + auVar120._8_8_ + auVar121._8_8_;
      auVar35._8_8_ = local_1b00._376_8_;
      auVar35._0_8_ = local_1b00._368_8_;
      auVar74._8_8_ = local_1b00._1240_8_;
      auVar74._0_8_ = local_1b00._1232_8_;
      auVar119 = vmulpd_avx512vl(auVar74,local_1120);
      local_1df0._8_8_ =
           (double)local_1b00._376_8_ * dStack_1478 + (double)local_1b00._808_8_ * dStack_12c8 +
           auVar119._8_8_;
      local_1df0._0_8_ =
           (double)local_1b00._368_8_ * local_1480 + (double)local_1b00._800_8_ * local_12d0 +
           auVar119._0_8_;
      auVar36._8_8_ = local_1b00._392_8_;
      auVar36._0_8_ = local_1b00._384_8_;
      auVar55._8_8_ = local_1b00._824_8_;
      auVar55._0_8_ = local_1b00._816_8_;
      auVar119 = vmulpd_avx512vl(auVar36,local_1470);
      auVar120 = vmulpd_avx512vl(auVar55,local_12c0);
      auVar75._8_8_ = local_1b00._1256_8_;
      auVar75._0_8_ = local_1b00._1248_8_;
      local_ca0 = auVar119._0_8_ + auVar120._0_8_ + (double)local_1b00._1248_8_ * local_1110;
      dStack_c98 = auVar119._8_8_ + auVar120._8_8_ + (double)local_1b00._1256_8_ * dStack_1108;
      auVar37._8_8_ = local_1b00._408_8_;
      auVar37._0_8_ = local_1b00._400_8_;
      local_1d90._8_8_ = local_1b00._1272_8_;
      local_1d90._0_8_ = local_1b00._1264_8_;
      local_2060._0_8_ =
           (double)local_1b00._400_8_ * local_1460 + (double)local_1b00._832_8_ * local_12b0 +
           (double)local_1b00._1264_8_ * local_1100;
      local_2060._8_8_ =
           (double)local_1b00._408_8_ * dStack_1458 + (double)local_1b00._840_8_ * dStack_12a8 +
           (double)local_1b00._1272_8_ * dStack_10f8;
      local_1da0._8_8_ = local_1b00._424_8_;
      local_1da0._0_8_ = local_1b00._416_8_;
      local_1db0._8_8_ = local_1b00._856_8_;
      local_1db0._0_8_ = local_1b00._848_8_;
      auVar147._0_8_ = (double)local_1b00._416_8_ * local_1450;
      auVar147._8_8_ = (double)local_1b00._424_8_ * dStack_1448;
      auVar119 = vmulpd_avx512vl(local_1db0,local_12a0);
      auVar119 = vaddpd_avx512vl(auVar147,auVar119);
      auVar76._8_8_ = local_1b00._1288_8_;
      auVar76._0_8_ = local_1b00._1280_8_;
      auVar120 = vmulpd_avx512vl(auVar76,local_10f0);
      local_2050 = vaddpd_avx512vl(auVar119,auVar120);
      auVar119 = vmulpd_avx512vl(auVar30,auVar30);
      auVar120 = vmulpd_avx512vl(auVar52,auVar52);
      auVar119 = vaddpd_avx512vl(auVar119,auVar120);
      auVar120 = vmulpd_avx512vl(auVar69,auVar69);
      auVar119 = vaddpd_avx512vl(auVar119,auVar120);
      auVar120 = vmulpd_avx512vl(auVar31,auVar31);
      local_d40 = (double)local_1b00._736_8_;
      dStack_d38 = (double)local_1b00._744_8_;
      auVar148._0_8_ = (double)local_1b00._736_8_ * (double)local_1b00._736_8_;
      auVar148._8_8_ = (double)local_1b00._744_8_ * (double)local_1b00._744_8_;
      auVar120 = vaddpd_avx512vl(auVar120,auVar148);
      auVar121 = vmulpd_avx512vl(auVar70,auVar70);
      auVar120 = vaddpd_avx512vl(auVar120,auVar121);
      auVar121 = vmulpd_avx512vl(auVar32,auVar32);
      local_ce0 = (double)local_1b00._752_8_;
      dStack_cd8 = (double)local_1b00._760_8_;
      auVar151._0_8_ = (double)local_1b00._752_8_ * (double)local_1b00._752_8_;
      auVar151._8_8_ = (double)local_1b00._760_8_ * (double)local_1b00._760_8_;
      auVar121 = vaddpd_avx512vl(auVar121,auVar151);
      auVar128 = vmulpd_avx512vl(auVar71,auVar71);
      auVar121 = vaddpd_avx512vl(auVar121,auVar128);
      auVar128 = vmulpd_avx512vl(auVar33,auVar33);
      auVar129 = vmulpd_avx512vl(auVar53,auVar53);
      auVar128 = vaddpd_avx512vl(auVar128,auVar129);
      auVar129 = vmulpd_avx512vl(auVar72,auVar72);
      auVar128 = vaddpd_avx512vl(auVar128,auVar129);
      auVar129 = vmulpd_avx512vl(auVar34,auVar34);
      auVar122 = vmulpd_avx512vl(auVar54,auVar54);
      auVar129 = vaddpd_avx512vl(auVar129,auVar122);
      auVar122 = vmulpd_avx512vl(auVar73,auVar73);
      auVar129 = vaddpd_avx512vl(auVar129,auVar122);
      auVar122 = vmulpd_avx512vl(auVar35,auVar35);
      auVar159._0_8_ = (double)local_1b00._800_8_ * (double)local_1b00._800_8_;
      auVar159._8_8_ = (double)local_1b00._808_8_ * (double)local_1b00._808_8_;
      auVar122 = vaddpd_avx512vl(auVar122,auVar159);
      auVar123 = vmulpd_avx512vl(auVar74,auVar74);
      auVar122 = vaddpd_avx512vl(auVar122,auVar123);
      auVar123 = vmulpd_avx512vl(auVar36,auVar36);
      auVar130 = vmulpd_avx512vl(auVar55,auVar55);
      auVar123 = vaddpd_avx512vl(auVar123,auVar130);
      auVar130 = vmulpd_avx512vl(auVar75,auVar75);
      auVar123 = vaddpd_avx512vl(auVar123,auVar130);
      auVar130 = vmulpd_avx512vl(auVar37,auVar37);
      local_1d80 = (double)local_1b00._832_8_;
      dStack_1d78 = (double)local_1b00._840_8_;
      auVar162._0_8_ = (double)local_1b00._832_8_ * (double)local_1b00._832_8_;
      auVar162._8_8_ = (double)local_1b00._840_8_ * (double)local_1b00._840_8_;
      auVar130 = vaddpd_avx512vl(auVar130,auVar162);
      auVar124 = vmulpd_avx512vl(local_1d90,local_1d90);
      auVar130 = vaddpd_avx512vl(auVar130,auVar124);
      auVar124 = vmulpd_avx512vl(local_1da0,local_1da0);
      auVar164._0_8_ = (double)local_1b00._848_8_ * (double)local_1b00._848_8_;
      auVar164._8_8_ = (double)local_1b00._856_8_ * (double)local_1b00._856_8_;
      auVar124 = vaddpd_avx512vl(auVar124,auVar164);
      auVar127 = vmulpd_avx512vl(auVar76,auVar76);
      auVar124 = vaddpd_avx512vl(auVar124,auVar127);
      _local_20c0 = local_2140;
      local_20b0 = local_1dc0;
      local_20a0._8_8_ = dStack_1dc8;
      local_20a0._0_8_ = local_1dd0;
      local_2090._8_8_ = dStack_1dd8;
      local_2090._0_8_ = local_1de0;
      local_2080 = local_1df0;
      local_2070._8_8_ = dStack_c98;
      local_2070._0_8_ = local_ca0;
      auVar119 = vaddpd_avx512vl(auVar119,auVar78);
      auVar120 = vaddpd_avx512vl(auVar120,auVar78);
      auVar121 = vaddpd_avx512vl(auVar121,auVar78);
      auVar128 = vaddpd_avx512vl(auVar128,auVar78);
      auVar129 = vaddpd_avx512vl(auVar129,auVar78);
      auVar122 = vaddpd_avx512vl(auVar122,auVar78);
      auVar123 = vaddpd_avx512vl(auVar123,auVar78);
      auVar130 = vaddpd_avx512vl(auVar130,auVar78);
      auVar124 = vaddpd_avx512vl(auVar124,auVar78);
      auVar119 = vmulpd_avx512vl(auVar119,auVar77);
      auVar149._0_8_ = local_f30 * auVar120._0_8_;
      auVar149._8_8_ = dStack_f28 * auVar120._8_8_;
      auVar152._0_8_ = local_f30 * auVar121._0_8_;
      auVar152._8_8_ = dStack_f28 * auVar121._8_8_;
      auVar155._0_8_ = local_f30 * auVar128._0_8_;
      auVar155._8_8_ = dStack_f28 * auVar128._8_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = this->m_Alpha;
      auVar120 = vmovddup_avx512vl(auVar4);
      auVar121 = vmulpd_avx512vl(local_2130._0_16_,auVar120);
      local_1cb0 = vaddpd_avx512vl(auVar119,auVar121);
      auVar119 = vmulpd_avx512vl(local_2140,auVar120);
      local_1ca0 = vaddpd_avx512vl(auVar149,auVar119);
      auVar119 = vmulpd_avx512vl(local_1dc0,auVar120);
      local_1c90 = vaddpd_avx512vl(auVar152,auVar119);
      auVar119 = vmulpd_avx512vl(local_20a0,auVar120);
      local_1c80 = vaddpd_avx512vl(auVar155,auVar119);
      auVar119 = vmulpd_avx512vl(local_2090,auVar120);
      local_1c70 = auVar129._0_8_ * local_f30 + auVar119._0_8_;
      dStack_1c68 = auVar129._8_8_ * dStack_f28 + auVar119._8_8_;
      auVar119 = vmulpd_avx512vl(local_1df0,auVar120);
      local_1c60 = auVar122._0_8_ * local_f30 + auVar119._0_8_;
      dStack_1c58 = auVar122._8_8_ * dStack_f28 + auVar119._8_8_;
      auVar119 = vmulpd_avx512vl(local_2070,auVar120);
      local_1c50._0_8_ = auVar123._0_8_ * local_f30 + auVar119._0_8_;
      local_1c50._8_8_ = auVar123._8_8_ * dStack_f28 + auVar119._8_8_;
      auVar119 = vmulpd_avx512vl(local_2060,auVar120);
      local_1c40._0_8_ = auVar130._0_8_ * local_f30 + auVar119._0_8_;
      local_1c40._8_8_ = auVar130._8_8_ * dStack_f28 + auVar119._8_8_;
      auVar119 = vmulpd_avx512vl(local_2050,auVar120);
      local_1c30._0_8_ = auVar124._0_8_ * local_f30 + auVar119._0_8_;
      local_1c30._8_8_ = auVar124._8_8_ * dStack_f28 + auVar119._8_8_;
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < lVar1) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00761cdb;
      pdVar114 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_1df0 = *(undefined1 (*) [16])(pdVar114 + local_1e88 * 0x12);
      local_1cb0 = vmulpd_avx512vl(local_1cb0,*(undefined1 (*) [16])(pdVar114 + local_1e88 * 0x12));
      auVar119 = *(undefined1 (*) [16])(pdVar114 + local_1e88 * 0x12 + 2);
      local_1ca0 = vmulpd_avx512vl(local_1ca0,auVar119);
      auVar121 = *(undefined1 (*) [16])(pdVar114 + local_1e88 * 0x12 + 4);
      local_1c90 = vmulpd_avx512vl(local_1c90,auVar121);
      local_1dc0 = *(undefined1 (*) [16])(pdVar114 + local_1e88 * 0x12 + 6);
      local_1c80 = vmulpd_avx512vl(local_1c80,
                                   *(undefined1 (*) [16])(pdVar114 + local_1e88 * 0x12 + 6));
      local_1dd0 = pdVar114[local_1e88 * 0x12 + 8];
      dStack_1dc8 = (pdVar114 + local_1e88 * 0x12 + 8)[1];
      local_1c70 = local_1c70 * local_1dd0;
      dStack_1c68 = dStack_1c68 * dStack_1dc8;
      local_1de0 = pdVar114[local_1e88 * 0x12 + 10];
      dStack_1dd8 = (pdVar114 + local_1e88 * 0x12 + 10)[1];
      local_1c60 = local_1c60 * local_1de0;
      dStack_1c58 = dStack_1c58 * dStack_1dd8;
      auVar128 = *(undefined1 (*) [16])(pdVar114 + local_1e88 * 0x12 + 0xc);
      local_1c50 = vmulpd_avx512vl(local_1c50,auVar128);
      auVar129 = *(undefined1 (*) [16])(pdVar114 + local_1e88 * 0x12 + 0xe);
      local_1c40 = vmulpd_avx512vl(local_1c40,auVar129);
      auVar122 = *(undefined1 (*) [16])(pdVar114 + local_1e88 * 0x12 + 0x10);
      local_1c30 = vmulpd_avx512vl(local_1c30,auVar122);
      uVar116 = 0xfffffffffffffffe;
      do {
        dVar3 = *(double *)(local_1b00 + uVar116 * 8 + 0xa8);
        dVar6 = *(double *)(local_1b00 + uVar116 * 8 + 0x138);
        dVar7 = *(double *)(local_1b00 + uVar116 * 8 + 600);
        dVar8 = *(double *)(local_1550 + uVar116 * 8 + 8);
        dVar9 = *(double *)(local_15b0 + uVar116 * 8 + -0x268);
        dVar10 = *(double *)(local_13a0 + uVar116 * 8 + 8);
        dVar11 = *(double *)(local_15b0 + uVar116 * 8 + -0xb8);
        dVar12 = *(double *)(local_11f0 + uVar116 * 8 + 8);
        dVar13 = *(double *)(local_14c0 + uVar116 * 8 + 8);
        dVar14 = local_1310[uVar116 + 1];
        dVar15 = *(double *)(local_15b0 + uVar116 * 8 + -0x148);
        dVar16 = local_1160[uVar116 + 1];
        *(double *)(local_20c0 + uVar116 * 8) =
             *(double *)(local_1b00 + uVar116 * 8 + 0x130) * *(double *)(local_1550 + uVar116 * 8) +
             *(double *)(local_15b0 + uVar116 * 8 + -0x270) * *(double *)(local_13a0 + uVar116 * 8)
             + *(double *)(local_15b0 + uVar116 * 8 + -0xc0) * *(double *)(local_11f0 + uVar116 * 8)
             + *(double *)(local_1b00 + uVar116 * 8 + 0xa0) * *(double *)(local_14c0 + uVar116 * 8)
             + *(double *)(local_1b00 + uVar116 * 8 + 0x250) * local_1310[uVar116] +
             *(double *)(local_15b0 + uVar116 * 8 + -0x150) * local_1160[uVar116];
        *(double *)(local_20c0 + uVar116 * 8 + 8) =
             dVar6 * dVar8 + dVar9 * dVar10 + dVar11 * dVar12 + dVar3 * dVar13 + dVar7 * dVar14 +
             dVar15 * dVar16;
        uVar116 = uVar116 + 2;
      } while (uVar116 < 0x10);
      auVar21._8_8_ = local_1b00._152_8_;
      auVar21._0_8_ = local_1b00._144_8_;
      auVar123 = vmulpd_avx512vl(auVar30,auVar21);
      auVar42._8_8_ = local_1b00._584_8_;
      auVar42._0_8_ = local_1b00._576_8_;
      auVar130 = vmulpd_avx512vl(auVar52,auVar42);
      auVar60._8_8_ = local_1b00._1016_8_;
      auVar60._0_8_ = local_1b00._1008_8_;
      auVar124 = vmulpd_avx512vl(auVar69,auVar60);
      auVar23._8_8_ = local_1b00._168_8_;
      auVar23._0_8_ = local_1b00._160_8_;
      auVar127 = vmulpd_avx512vl(auVar31,auVar23);
      auVar79._8_8_ = uVar91;
      auVar79._0_8_ = uVar90;
      auVar44._8_8_ = local_1b00._600_8_;
      auVar44._0_8_ = local_1b00._592_8_;
      auVar131 = vmulpd_avx512vl(auVar79,auVar44);
      auVar62._8_8_ = local_1b00._1032_8_;
      auVar62._0_8_ = local_1b00._1024_8_;
      auVar132 = vmulpd_avx512vl(auVar70,auVar62);
      auVar46._8_8_ = local_1b00._632_8_;
      auVar46._0_8_ = local_1b00._624_8_;
      auVar133 = vmulpd_avx512vl(auVar53,auVar46);
      auVar25._8_8_ = local_1b00._216_8_;
      auVar25._0_8_ = local_1b00._208_8_;
      auVar134 = vmulpd_avx512vl(auVar34,auVar25);
      auVar48._8_8_ = local_1b00._648_8_;
      auVar48._0_8_ = local_1b00._640_8_;
      auVar135 = vmulpd_avx512vl(auVar54,auVar48);
      auVar64._8_8_ = local_1b00._1080_8_;
      auVar64._0_8_ = local_1b00._1072_8_;
      auVar125 = vmulpd_avx512vl(auVar73,auVar64);
      auVar27._8_8_ = local_1b00._232_8_;
      auVar27._0_8_ = local_1b00._224_8_;
      auVar126 = vmulpd_avx512vl(auVar35,auVar27);
      auVar66._8_8_ = local_1b00._1096_8_;
      auVar66._0_8_ = local_1b00._1088_8_;
      auVar141 = vmulpd_avx512vl(auVar74,auVar66);
      auVar136 = vmulpd_avx512vl(auVar120,local_2130._0_16_);
      auVar137 = vmulpd_avx512vl(auVar120,_local_20c0);
      auVar138 = vmulpd_avx512vl(auVar120,local_20b0);
      auVar139 = vmulpd_avx512vl(auVar120,local_20a0);
      auVar140 = vmulpd_avx512vl(auVar120,local_2090);
      auVar142 = vmulpd_avx512vl(auVar120,local_2080);
      auVar143 = vmulpd_avx512vl(auVar120,local_2070);
      auVar153._0_8_ =
           auVar143._0_8_ +
           (double)uVar86 * (double)local_1b00._240_8_ + (double)uVar96 * (double)local_1b00._672_8_
           + (double)uVar102 * (double)local_1b00._1104_8_;
      auVar153._8_8_ =
           auVar143._8_8_ +
           (double)uVar87 * (double)local_1b00._248_8_ + (double)uVar97 * (double)local_1b00._680_8_
           + (double)uVar103 * (double)local_1b00._1112_8_;
      auVar143 = vmulpd_avx512vl(auVar120,local_2060);
      auVar156._0_8_ =
           auVar143._0_8_ +
           (double)local_1d90._0_8_ * (double)local_1b00._1120_8_ +
           local_1d80 * (double)local_1b00._688_8_ + (double)uVar88 * (double)local_1b00._256_8_;
      auVar156._8_8_ =
           auVar143._8_8_ +
           (double)local_1d90._8_8_ * (double)local_1b00._1128_8_ +
           dStack_1d78 * (double)local_1b00._696_8_ + (double)uVar89 * (double)local_1b00._264_8_;
      auVar143 = vmulpd_avx512vl(auVar120,local_2050);
      auVar158._0_8_ =
           (double)local_1da0._0_8_ * (double)local_1b00._272_8_ +
           (double)local_1db0._0_8_ * (double)local_1b00._704_8_ +
           (double)uVar104 * (double)local_1b00._1136_8_ + auVar143._0_8_;
      auVar158._8_8_ =
           (double)local_1da0._8_8_ * (double)local_1b00._280_8_ +
           (double)local_1db0._8_8_ * (double)local_1b00._712_8_ +
           (double)uVar105 * (double)local_1b00._1144_8_ + auVar143._8_8_;
      local_1b90 = (auVar136._0_8_ + auVar123._0_8_ + auVar130._0_8_ + auVar124._0_8_) *
                   (double)local_1df0._0_8_;
      dStack_1b88 = (auVar136._8_8_ + auVar123._8_8_ + auVar130._8_8_ + auVar124._8_8_) *
                    (double)local_1df0._8_8_;
      local_2130._0_8_ = auVar119._0_8_;
      local_2130._8_8_ = auVar119._8_8_;
      local_1b80[0] =
           (auVar137._0_8_ + auVar127._0_8_ + auVar131._0_8_ + auVar132._0_8_) *
           (double)local_2130._0_8_;
      local_1b80[1] =
           (auVar137._8_8_ + auVar127._8_8_ + auVar131._8_8_ + auVar132._8_8_) *
           (double)local_2130._8_8_;
      local_2140._0_8_ = auVar121._0_8_;
      local_2140._8_8_ = auVar121._8_8_;
      local_1b80[2] =
           (auVar138._0_8_ +
           (double)uVar82 * (double)local_1b00._176_8_ + (double)uVar92 * (double)local_1b00._608_8_
           + (double)uVar98 * (double)local_1b00._1040_8_) * (double)local_2140._0_8_;
      local_1b80[3] =
           (auVar138._8_8_ +
           (double)uVar83 * (double)local_1b00._184_8_ + (double)uVar93 * (double)local_1b00._616_8_
           + (double)uVar99 * (double)local_1b00._1048_8_) * (double)local_2140._8_8_;
      local_1b60 = (auVar139._0_8_ +
                   (double)uVar84 * (double)local_1b00._192_8_ + auVar133._0_8_ +
                   (double)uVar100 * (double)local_1b00._1056_8_) * (double)local_1dc0._0_8_;
      dStack_1b58 = (auVar139._8_8_ +
                    (double)uVar85 * (double)local_1b00._200_8_ + auVar133._8_8_ +
                    (double)uVar101 * (double)local_1b00._1064_8_) * (double)local_1dc0._8_8_;
      local_1b50 = (auVar140._0_8_ + auVar134._0_8_ + auVar135._0_8_ + auVar125._0_8_) * local_1dd0;
      dStack_1b48 = (auVar140._8_8_ + auVar134._8_8_ + auVar135._8_8_ + auVar125._8_8_) *
                    dStack_1dc8;
      local_1b40 = (auVar142._0_8_ +
                   auVar126._0_8_ + (double)uVar94 * (double)local_1b00._656_8_ + auVar141._0_8_) *
                   local_1de0;
      dStack_1b38 = (auVar142._8_8_ +
                    auVar126._8_8_ + (double)uVar95 * (double)local_1b00._664_8_ + auVar141._8_8_) *
                    dStack_1dd8;
      local_1b30 = vmulpd_avx512vl(auVar128,auVar153);
      local_1b20 = vmulpd_avx512vl(auVar129,auVar156);
      local_1b10 = vmulpd_avx512vl(auVar122,auVar158);
      uVar116 = 0xfffffffffffffffe;
      do {
        dVar3 = *(double *)(local_1b00 + uVar116 * 8 + 0x18);
        dVar6 = *(double *)(local_1b00 + uVar116 * 8 + 0x138);
        dVar7 = *(double *)(local_1b00 + uVar116 * 8 + 0x1c8);
        dVar8 = *(double *)(local_15b0 + uVar116 * 8 + -0x28);
        dVar9 = *(double *)(local_15b0 + uVar116 * 8 + -0x268);
        dVar10 = *(double *)(local_1420 + uVar116 * 8 + -8);
        dVar11 = *(double *)(local_15b0 + uVar116 * 8 + -0xb8);
        dVar12 = *(double *)(local_1280 + uVar116 * 8 + 8);
        dVar13 = *(double *)(local_14c0 + uVar116 * 8 + 8);
        dVar14 = local_1310[uVar116 + 1];
        dVar15 = *(double *)(local_15b0 + uVar116 * 8 + -0x1d8);
        dVar16 = local_1160[uVar116 + 1];
        *(double *)(local_20c0 + uVar116 * 8) =
             *(double *)(local_1b00 + uVar116 * 8 + 0x130) *
             *(double *)(local_15b0 + uVar116 * 8 + -0x30) +
             *(double *)(local_15b0 + uVar116 * 8 + -0x270) * local_1430[uVar116] +
             *(double *)(local_15b0 + uVar116 * 8 + -0xc0) * *(double *)(local_1280 + uVar116 * 8) +
             *(double *)(local_1b00 + uVar116 * 8 + 0x10) * *(double *)(local_14c0 + uVar116 * 8) +
             *(double *)(local_1b00 + uVar116 * 8 + 0x1c0) * local_1310[uVar116] +
             *(double *)(local_15b0 + uVar116 * 8 + -0x1e0) * local_1160[uVar116];
        *(double *)(local_20c0 + uVar116 * 8 + 8) =
             dVar6 * dVar8 + dVar9 * dVar10 + dVar11 * dVar12 + dVar3 * dVar13 + dVar7 * dVar14 +
             dVar15 * dVar16;
        uVar116 = uVar116 + 2;
      } while (uVar116 < 0x10);
      auVar17._8_8_ = local_1b00._8_8_;
      auVar17._0_8_ = local_1b00._0_8_;
      auVar119 = vmulpd_avx512vl(auVar30,auVar17);
      auVar38._8_8_ = local_1b00._440_8_;
      auVar38._0_8_ = local_1b00._432_8_;
      auVar121 = vmulpd_avx512vl(auVar52,auVar38);
      auVar56._8_8_ = local_1b00._872_8_;
      auVar56._0_8_ = local_1b00._864_8_;
      auVar122 = vmulpd_avx512vl(auVar69,auVar56);
      auVar18._8_8_ = local_1b00._24_8_;
      auVar18._0_8_ = local_1b00._16_8_;
      auVar123 = vmulpd_avx512vl(auVar31,auVar18);
      auVar39._8_8_ = local_1b00._456_8_;
      auVar39._0_8_ = local_1b00._448_8_;
      auVar130 = vmulpd_avx512vl(auVar79,auVar39);
      auVar57._8_8_ = local_1b00._888_8_;
      auVar57._0_8_ = local_1b00._880_8_;
      auVar124 = vmulpd_avx512vl(auVar70,auVar57);
      auVar40._8_8_ = local_1b00._488_8_;
      auVar40._0_8_ = local_1b00._480_8_;
      auVar127 = vmulpd_avx512vl(auVar53,auVar40);
      auVar19._8_8_ = local_1b00._72_8_;
      auVar19._0_8_ = local_1b00._64_8_;
      auVar131 = vmulpd_avx512vl(auVar34,auVar19);
      auVar41._8_8_ = local_1b00._504_8_;
      auVar41._0_8_ = local_1b00._496_8_;
      auVar132 = vmulpd_avx512vl(auVar54,auVar41);
      auVar58._8_8_ = local_1b00._936_8_;
      auVar58._0_8_ = local_1b00._928_8_;
      auVar133 = vmulpd_avx512vl(auVar73,auVar58);
      auVar20._8_8_ = local_1b00._88_8_;
      auVar20._0_8_ = local_1b00._80_8_;
      auVar134 = vmulpd_avx512vl(auVar35,auVar20);
      auVar59._8_8_ = local_1b00._952_8_;
      auVar59._0_8_ = local_1b00._944_8_;
      auVar135 = vmulpd_avx512vl(auVar74,auVar59);
      auVar118 = vmulpd_avx512vl(auVar120,auVar118);
      auVar125 = vmulpd_avx512vl(auVar120,_local_20c0);
      auVar126 = vmulpd_avx512vl(auVar120,local_20b0);
      auVar141 = vmulpd_avx512vl(auVar120,local_20a0);
      auVar136 = vmulpd_avx512vl(auVar120,local_2090);
      auVar137 = vmulpd_avx512vl(auVar120,local_2080);
      auVar138 = vmulpd_avx512vl(auVar120,local_2070);
      auVar154._0_8_ =
           auVar138._0_8_ +
           (double)uVar86 * (double)local_1b00._96_8_ + (double)uVar96 * (double)local_1b00._528_8_
           + (double)uVar102 * (double)local_1b00._960_8_;
      auVar154._8_8_ =
           auVar138._8_8_ +
           (double)uVar87 * (double)local_1b00._104_8_ + (double)uVar97 * (double)local_1b00._536_8_
           + (double)uVar103 * (double)local_1b00._968_8_;
      auVar138 = vmulpd_avx512vl(auVar120,local_2060);
      auVar157._0_8_ =
           auVar138._0_8_ +
           (double)local_1d90._0_8_ * (double)local_1b00._976_8_ +
           local_1d80 * (double)local_1b00._544_8_ + (double)uVar88 * (double)local_1b00._112_8_;
      auVar157._8_8_ =
           auVar138._8_8_ +
           (double)local_1d90._8_8_ * (double)local_1b00._984_8_ +
           dStack_1d78 * (double)local_1b00._552_8_ + (double)uVar89 * (double)local_1b00._120_8_;
      auVar120 = vmulpd_avx512vl(auVar120,local_2050);
      local_1d40 = (auVar118._0_8_ + auVar119._0_8_ + auVar121._0_8_ + auVar122._0_8_) *
                   (double)local_1df0._0_8_;
      dStack_1d38 = (auVar118._8_8_ + auVar119._8_8_ + auVar121._8_8_ + auVar122._8_8_) *
                    (double)local_1df0._8_8_;
      local_1d30[0] =
           (auVar125._0_8_ + auVar123._0_8_ + auVar130._0_8_ + auVar124._0_8_) *
           (double)local_2130._0_8_;
      local_1d30[1] =
           (auVar125._8_8_ + auVar123._8_8_ + auVar130._8_8_ + auVar124._8_8_) *
           (double)local_2130._8_8_;
      local_1d30[2] =
           (auVar126._0_8_ +
           (double)uVar82 * (double)local_1b00._32_8_ + (double)uVar92 * (double)local_1b00._464_8_
           + (double)uVar98 * (double)local_1b00._896_8_) * (double)local_2140._0_8_;
      local_1d30[3] =
           (auVar126._8_8_ +
           (double)uVar83 * (double)local_1b00._40_8_ + (double)uVar93 * (double)local_1b00._472_8_
           + (double)uVar99 * (double)local_1b00._904_8_) * (double)local_2140._8_8_;
      local_1d10 = (auVar141._0_8_ +
                   (double)uVar84 * (double)local_1b00._48_8_ + auVar127._0_8_ +
                   (double)uVar100 * (double)local_1b00._912_8_) * (double)local_1dc0._0_8_;
      dStack_1d08 = (auVar141._8_8_ +
                    (double)uVar85 * (double)local_1b00._56_8_ + auVar127._8_8_ +
                    (double)uVar101 * (double)local_1b00._920_8_) * (double)local_1dc0._8_8_;
      local_1d00 = (auVar136._0_8_ + auVar131._0_8_ + auVar132._0_8_ + auVar133._0_8_) * local_1dd0;
      dStack_1cf8 = (auVar136._8_8_ + auVar131._8_8_ + auVar132._8_8_ + auVar133._8_8_) *
                    dStack_1dc8;
      local_1cf0 = (auVar137._0_8_ +
                   auVar134._0_8_ + (double)uVar94 * (double)local_1b00._512_8_ + auVar135._0_8_) *
                   local_1de0;
      dStack_1ce8 = (auVar137._8_8_ +
                    auVar134._8_8_ + (double)uVar95 * (double)local_1b00._520_8_ + auVar135._8_8_) *
                    dStack_1dd8;
      local_1ce0 = vmulpd_avx512vl(auVar128,auVar154);
      local_1cd0 = vmulpd_avx512vl(auVar129,auVar157);
      local_1cc0 = ((double)local_1da0._0_8_ * (double)local_1b00._128_8_ +
                    (double)local_1db0._0_8_ * (double)local_1b00._560_8_ +
                    (double)uVar104 * (double)local_1b00._992_8_ + auVar120._0_8_) *
                   pdVar114[uVar111 * 0x12 + 0x10];
      dStack_1cb8 = ((double)local_1da0._8_8_ * (double)local_1b00._136_8_ +
                     (double)local_1db0._8_8_ * (double)local_1b00._568_8_ +
                     (double)uVar105 * (double)local_1b00._1000_8_ + auVar120._8_8_) *
                    (pdVar114 + uVar111 * 0x12 + 0x10)[1];
      uVar116 = 0xfffffffffffffffe;
      do {
        dVar3 = *(double *)(local_1b00 + uVar116 * 8 + 0x18);
        dVar6 = *(double *)(local_1b00 + uVar116 * 8 + 0xa8);
        dVar7 = *(double *)(local_1b00 + uVar116 * 8 + 0x1c8);
        dVar8 = *(double *)(local_15b0 + uVar116 * 8 + -0x28);
        dVar9 = *(double *)(local_1b00 + uVar116 * 8 + 600);
        dVar10 = *(double *)(local_1420 + uVar116 * 8 + -8);
        dVar11 = *(double *)(local_15b0 + uVar116 * 8 + -0x148);
        dVar12 = *(double *)(local_1280 + uVar116 * 8 + 8);
        dVar13 = *(double *)(local_1550 + uVar116 * 8 + 8);
        dVar14 = *(double *)(local_13a0 + uVar116 * 8 + 8);
        dVar15 = *(double *)(local_15b0 + uVar116 * 8 + -0x1d8);
        dVar16 = *(double *)(local_11f0 + uVar116 * 8 + 8);
        *(double *)(local_20c0 + uVar116 * 8) =
             *(double *)(local_1b00 + uVar116 * 8 + 0xa0) *
             *(double *)(local_15b0 + uVar116 * 8 + -0x30) +
             *(double *)(local_1b00 + uVar116 * 8 + 0x250) * local_1430[uVar116] +
             *(double *)(local_15b0 + uVar116 * 8 + -0x150) * *(double *)(local_1280 + uVar116 * 8)
             + *(double *)(local_1b00 + uVar116 * 8 + 0x10) * *(double *)(local_1550 + uVar116 * 8)
             + *(double *)(local_1b00 + uVar116 * 8 + 0x1c0) * *(double *)(local_13a0 + uVar116 * 8)
             + *(double *)(local_15b0 + uVar116 * 8 + -0x1e0) *
               *(double *)(local_11f0 + uVar116 * 8);
        *(double *)(local_20c0 + uVar116 * 8 + 8) =
             dVar6 * dVar8 + dVar9 * dVar10 + dVar11 * dVar12 + dVar3 * dVar13 + dVar7 * dVar14 +
             dVar15 * dVar16;
        uVar116 = uVar116 + 2;
      } while (uVar116 < 0x10);
      dVar3 = this->m_Alpha;
      local_1e80 = dVar3 * dVar115 +
                   (double)local_1b00._0_8_ * (double)local_1b00._144_8_ +
                   (double)local_1b00._432_8_ * (double)local_1b00._576_8_ +
                   (double)local_1b00._864_8_ * (double)local_1b00._1008_8_;
      dStack_1e78 = dVar3 * dVar144 +
                    (double)local_1b00._8_8_ * (double)local_1b00._152_8_ +
                    (double)local_1b00._440_8_ * (double)local_1b00._584_8_ +
                    (double)local_1b00._872_8_ * (double)local_1b00._1016_8_;
      local_1e70[0] =
           dVar3 * (double)local_20c0 +
           (double)local_1b00._16_8_ * (double)local_1b00._160_8_ +
           (double)local_1b00._448_8_ * (double)local_1b00._592_8_ +
           (double)local_1b00._880_8_ * (double)local_1b00._1024_8_;
      local_1e70[1] =
           dVar3 * dStack_20b8 +
           (double)local_1b00._24_8_ * (double)local_1b00._168_8_ +
           (double)local_1b00._456_8_ * (double)local_1b00._600_8_ +
           (double)local_1b00._888_8_ * (double)local_1b00._1032_8_;
      local_1e70[2] =
           dVar3 * (double)local_20b0._0_8_ +
           (double)local_1b00._32_8_ * (double)local_1b00._176_8_ +
           (double)local_1b00._464_8_ * (double)local_1b00._608_8_ +
           (double)local_1b00._896_8_ * (double)local_1b00._1040_8_;
      local_1e70[3] =
           dVar3 * (double)local_20b0._8_8_ +
           (double)local_1b00._40_8_ * (double)local_1b00._184_8_ +
           (double)local_1b00._472_8_ * (double)local_1b00._616_8_ +
           (double)local_1b00._904_8_ * (double)local_1b00._1048_8_;
      local_1e50 = dVar3 * (double)local_20a0._0_8_ +
                   (double)local_1b00._48_8_ * (double)local_1b00._192_8_ +
                   (double)local_1b00._480_8_ * (double)local_1b00._624_8_ +
                   (double)local_1b00._912_8_ * (double)local_1b00._1056_8_;
      dStack_1e48 = dVar3 * (double)local_20a0._8_8_ +
                    (double)local_1b00._56_8_ * (double)local_1b00._200_8_ +
                    (double)local_1b00._488_8_ * (double)local_1b00._632_8_ +
                    (double)local_1b00._920_8_ * (double)local_1b00._1064_8_;
      local_1e40 = dVar3 * (double)local_2090._0_8_ +
                   (double)local_1b00._64_8_ * (double)local_1b00._208_8_ +
                   (double)local_1b00._496_8_ * (double)local_1b00._640_8_ +
                   (double)local_1b00._928_8_ * (double)local_1b00._1072_8_;
      dStack_1e38 = dVar3 * (double)local_2090._8_8_ +
                    (double)local_1b00._72_8_ * (double)local_1b00._216_8_ +
                    (double)local_1b00._504_8_ * (double)local_1b00._648_8_ +
                    (double)local_1b00._936_8_ * (double)local_1b00._1080_8_;
      local_1e30 = dVar3 * (double)local_2080._0_8_ +
                   (double)local_1b00._80_8_ * (double)local_1b00._224_8_ +
                   (double)local_1b00._512_8_ * (double)local_1b00._656_8_ +
                   (double)local_1b00._944_8_ * (double)local_1b00._1088_8_;
      dStack_1e28 = dVar3 * (double)local_2080._8_8_ +
                    (double)local_1b00._88_8_ * (double)local_1b00._232_8_ +
                    (double)local_1b00._520_8_ * (double)local_1b00._664_8_ +
                    (double)local_1b00._952_8_ * (double)local_1b00._1096_8_;
      local_1e20 = dVar3 * (double)local_2070._0_8_ +
                   (double)local_1b00._96_8_ * (double)local_1b00._240_8_ +
                   (double)local_1b00._528_8_ * (double)local_1b00._672_8_ +
                   (double)local_1b00._960_8_ * (double)local_1b00._1104_8_;
      dStack_1e18 = dVar3 * (double)local_2070._8_8_ +
                    (double)local_1b00._104_8_ * (double)local_1b00._248_8_ +
                    (double)local_1b00._536_8_ * (double)local_1b00._680_8_ +
                    (double)local_1b00._968_8_ * (double)local_1b00._1112_8_;
      local_1e10 = dVar3 * (double)local_2060._0_8_ +
                   (double)local_1b00._112_8_ * (double)local_1b00._256_8_ +
                   (double)local_1b00._544_8_ * (double)local_1b00._688_8_ +
                   (double)local_1b00._976_8_ * (double)local_1b00._1120_8_;
      dStack_1e08 = dVar3 * (double)local_2060._8_8_ +
                    (double)local_1b00._120_8_ * (double)local_1b00._264_8_ +
                    (double)local_1b00._552_8_ * (double)local_1b00._696_8_ +
                    (double)local_1b00._984_8_ * (double)local_1b00._1128_8_;
      local_1e00 = dVar3 * (double)local_2050._0_8_ +
                   (double)local_1b00._128_8_ * (double)local_1b00._272_8_ +
                   (double)local_1b00._560_8_ * (double)local_1b00._704_8_ +
                   (double)local_1b00._992_8_ * (double)local_1b00._1136_8_;
      dStack_1df8 = dVar3 * (double)local_2050._8_8_ +
                    (double)local_1b00._136_8_ * (double)local_1b00._280_8_ +
                    (double)local_1b00._568_8_ * (double)local_1b00._712_8_ +
                    (double)local_1b00._1000_8_ * (double)local_1b00._1144_8_;
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < lVar1) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00761cdb;
      pdVar114 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_1e80 = pdVar114[uVar111 * 0x12] * local_1e80;
      dStack_1e78 = (pdVar114 + uVar111 * 0x12)[1] * dStack_1e78;
      local_1e70[0] = pdVar114[uVar111 * 0x12 + 2] * local_1e70[0];
      local_1e70[1] = (pdVar114 + uVar111 * 0x12 + 2)[1] * local_1e70[1];
      local_1e70[2] = pdVar114[uVar111 * 0x12 + 4] * local_1e70[2];
      local_1e70[3] = (pdVar114 + uVar111 * 0x12 + 4)[1] * local_1e70[3];
      local_1e50 = pdVar114[uVar111 * 0x12 + 6] * local_1e50;
      dStack_1e48 = (pdVar114 + uVar111 * 0x12 + 6)[1] * dStack_1e48;
      local_1e40 = pdVar114[uVar111 * 0x12 + 8] * local_1e40;
      dStack_1e38 = (pdVar114 + uVar111 * 0x12 + 8)[1] * dStack_1e38;
      local_1e30 = pdVar114[uVar111 * 0x12 + 10] * local_1e30;
      dStack_1e28 = (pdVar114 + uVar111 * 0x12 + 10)[1] * dStack_1e28;
      local_1e20 = pdVar114[uVar111 * 0x12 + 0xc] * local_1e20;
      dStack_1e18 = (pdVar114 + uVar111 * 0x12 + 0xc)[1] * dStack_1e18;
      local_1e10 = pdVar114[uVar111 * 0x12 + 0xe] * local_1e10;
      dStack_1e08 = (pdVar114 + uVar111 * 0x12 + 0xe)[1] * dStack_1e08;
      local_1e00 = pdVar114[uVar111 * 0x12 + 0x10] * local_1e00;
      dStack_1df8 = (pdVar114 + uVar111 * 0x12 + 0x10)[1] * dStack_1df8;
      pLVar5 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar1 = (long)pLVar5[uVar111].m_material.
                    super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      this_00 = (ChElementShellANCF_3833 *)
                pLVar5[uVar111].m_material.
                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      pCVar117 = (ChElementShellANCF_3833 *)local_e80;
      if (this_00 == (ChElementShellANCF_3833 *)0x0) {
        memcpy((ChElementShellANCF_3833 *)local_e80,(void *)(lVar1 + 0x20),0x120);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar80 = (ChKblockGeneric *)
                    ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
          *(int *)&(pCVar80->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar80->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar80 = (ChKblockGeneric *)
                    ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
          *(int *)&(pCVar80->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar80->super_ChKblock)._vptr_ChKblock + 1;
        }
        memcpy((ChElementShellANCF_3833 *)local_e80,(void *)(lVar1 + 0x20),0x120);
        if (this_00 != (ChElementShellANCF_3833 *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          pCVar117 = this_00;
        }
      }
      RotateReorderStiffnessMatrix
                (pCVar117,(ChMatrixNM<double,_6,_6> *)local_e80,
                 (this->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar111].m_theta);
      uVar87 = local_e80._40_8_;
      uVar86 = local_e80._32_8_;
      uVar85 = local_e80._24_8_;
      uVar84 = local_e80._16_8_;
      uVar83 = local_e80._8_8_;
      uVar82 = local_e80._0_8_;
      dVar115 = local_1d50;
      uVar111 = 0xfffffffffffffffe;
      do {
        dVar144 = local_1c10[uVar111 + 1];
        dVar3 = local_f00[uVar111 + 1];
        dVar6 = *(double *)(local_1ca0 + uVar111 * 8 + 8);
        dVar7 = local_1b80[uVar111 + 1];
        dVar8 = local_1d30[uVar111 + 1];
        dVar9 = local_1e70[uVar111 + 1];
        local_fb0[uVar111] =
             (double)uVar82 * local_1c10[uVar111] + (double)uVar83 * local_f00[uVar111] +
             (double)uVar84 * *(double *)(local_1ca0 + uVar111 * 8) +
             (double)uVar85 * local_1b80[uVar111] + (double)uVar86 * local_1d30[uVar111] +
             (double)uVar87 * local_1e70[uVar111];
        local_fb0[uVar111 + 1] =
             (double)uVar82 * dVar144 + (double)uVar83 * dVar3 + (double)uVar84 * dVar6 +
             (double)uVar85 * dVar7 + (double)uVar86 * dVar8 + (double)uVar87 * dVar9;
        uVar93 = local_e80._88_8_;
        uVar92 = local_e80._80_8_;
        uVar91 = local_e80._72_8_;
        uVar90 = local_e80._64_8_;
        uVar89 = local_e80._56_8_;
        uVar88 = local_e80._48_8_;
        uVar111 = uVar111 + 2;
      } while (uVar111 < 0x10);
      uVar111 = 0xfffffffffffffffe;
      do {
        dVar144 = local_1c10[uVar111 + 1];
        dVar3 = local_f00[uVar111 + 1];
        dVar6 = *(double *)(local_1ca0 + uVar111 * 8 + 8);
        dVar7 = local_1b80[uVar111 + 1];
        dVar8 = local_1d30[uVar111 + 1];
        dVar9 = local_1e70[uVar111 + 1];
        local_1040[uVar111] =
             (double)uVar88 * local_1c10[uVar111] + (double)uVar89 * local_f00[uVar111] +
             (double)uVar90 * *(double *)(local_1ca0 + uVar111 * 8) +
             (double)uVar91 * local_1b80[uVar111] + (double)uVar92 * local_1d30[uVar111] +
             (double)uVar93 * local_1e70[uVar111];
        local_1040[uVar111 + 1] =
             (double)uVar88 * dVar144 + (double)uVar89 * dVar3 + (double)uVar90 * dVar6 +
             (double)uVar91 * dVar7 + (double)uVar92 * dVar8 + (double)uVar93 * dVar9;
        pLVar110 = local_df8;
        pLVar109 = local_e00;
        pLVar5 = local_e08;
        psVar108 = local_e10;
        psVar107 = local_e18;
        psVar106 = local_e20;
        uVar111 = uVar111 + 2;
      } while (uVar111 < 0x10);
      uVar111 = 0xfffffffffffffffe;
      do {
        dVar144 = local_1c10[uVar111 + 1];
        dVar3 = local_f00[uVar111 + 1];
        dVar6 = *(double *)(local_1ca0 + uVar111 * 8 + 8);
        dVar7 = local_1b80[uVar111 + 1];
        dVar8 = local_1d30[uVar111 + 1];
        dVar9 = local_1e70[uVar111 + 1];
        local_10d0[uVar111] =
             (double)psVar106 * local_1c10[uVar111] + (double)psVar107 * local_f00[uVar111] +
             (double)psVar108 * *(double *)(local_1ca0 + uVar111 * 8) +
             (double)pLVar5 * local_1b80[uVar111] + (double)pLVar109 * local_1d30[uVar111] +
             (double)pLVar110 * local_1e70[uVar111];
        local_10d0[uVar111 + 1] =
             (double)psVar106 * dVar144 + (double)psVar107 * dVar3 + (double)psVar108 * dVar6 +
             (double)pLVar5 * dVar7 + (double)pLVar109 * dVar8 + (double)pLVar110 * dVar9;
        uVar111 = uVar111 + 2;
      } while (uVar111 < 0x10);
      uVar111 = 0xfffffffffffffffe;
      do {
        dVar144 = local_1c10[uVar111 + 1];
        dVar3 = local_f00[uVar111 + 1];
        dVar6 = *(double *)(local_1ca0 + uVar111 * 8 + 8);
        dVar7 = local_1b80[uVar111 + 1];
        dVar8 = local_1d30[uVar111 + 1];
        dVar9 = local_1e70[uVar111 + 1];
        local_1f10[uVar111] =
             (double)local_df0 * local_1c10[uVar111] + (double)local_de8 * local_f00[uVar111] +
             (double)local_de0 * *(double *)(local_1ca0 + uVar111 * 8) +
             local_dd8 * local_1b80[uVar111] + local_dd0 * local_1d30[uVar111] +
             local_dc8 * local_1e70[uVar111];
        local_1f10[uVar111 + 1] =
             (double)local_df0 * dVar144 + (double)local_de8 * dVar3 + (double)local_de0 * dVar6 +
             local_dd8 * dVar7 + local_dd0 * dVar8 + local_dc8 * dVar9;
        uVar111 = uVar111 + 2;
      } while (uVar111 < 0x10);
      uVar111 = 0xfffffffffffffffe;
      do {
        dVar144 = local_1c10[uVar111 + 1];
        dVar3 = local_f00[uVar111 + 1];
        dVar6 = *(double *)(local_1ca0 + uVar111 * 8 + 8);
        dVar7 = local_1b80[uVar111 + 1];
        dVar8 = local_1d30[uVar111 + 1];
        dVar9 = local_1e70[uVar111 + 1];
        local_1fa0[uVar111] =
             local_dc0 * local_1c10[uVar111] + local_db8 * local_f00[uVar111] +
             local_db0 * *(double *)(local_1ca0 + uVar111 * 8) + local_da8 * local_1b80[uVar111] +
             local_da0 * local_1d30[uVar111] + local_d98 * local_1e70[uVar111];
        local_1fa0[uVar111 + 1] =
             local_dc0 * dVar144 + local_db8 * dVar3 + local_db0 * dVar6 + local_da8 * dVar7 +
             local_da0 * dVar8 + local_d98 * dVar9;
        uVar111 = uVar111 + 2;
      } while (uVar111 < 0x10);
      uVar111 = 0xfffffffffffffffe;
      do {
        dVar144 = local_1c10[uVar111 + 1];
        dVar3 = local_f00[uVar111 + 1];
        dVar6 = *(double *)(local_1ca0 + uVar111 * 8 + 8);
        dVar7 = local_1b80[uVar111 + 1];
        dVar8 = local_1d30[uVar111 + 1];
        dVar9 = local_1e70[uVar111 + 1];
        local_2030[uVar111] =
             local_d90 * local_1c10[uVar111] + local_d88 * local_f00[uVar111] +
             local_d80 * *(double *)(local_1ca0 + uVar111 * 8) + local_d78 * local_1b80[uVar111] +
             local_d70 * local_1d30[uVar111] + local_d68 * local_1e70[uVar111];
        local_2030[uVar111 + 1] =
             local_d90 * dVar144 + local_d88 * dVar3 + local_d80 * dVar6 + local_d78 * dVar7 +
             local_d70 * dVar8 + local_d68 * dVar9;
        uVar111 = uVar111 + 2;
      } while (uVar111 < 0x10);
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = (double)local_1b00._0_8_ * local_fc0 + (double)local_1b00._144_8_ * local_2040 +
                 (double)local_1b00._288_8_ * local_1fb0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[1] = (double)local_1b00._8_8_ * dStack_fb8 + (double)local_1b00._152_8_ * dStack_2038 +
                 (double)local_1b00._296_8_ * dStack_1fa8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[2] = (double)local_1b00._16_8_ * local_fb0[0] +
                 (double)local_1b00._160_8_ * local_2030[0] +
                 (double)local_1b00._304_8_ * local_1fa0[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[3] = (double)local_1b00._24_8_ * local_fb0[1] +
                 (double)local_1b00._168_8_ * local_2030[1] +
                 (double)local_1b00._312_8_ * local_1fa0[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[4] = (double)local_1b00._32_8_ * local_fb0[2] +
                 (double)local_1b00._176_8_ * local_2030[2] +
                 (double)local_1b00._320_8_ * local_1fa0[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[5] = (double)local_1b00._40_8_ * local_fb0[3] +
                 (double)local_1b00._184_8_ * local_2030[3] +
                 (double)local_1b00._328_8_ * local_1fa0[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[6] = (double)local_1b00._48_8_ * local_f90 + (double)local_1b00._192_8_ * local_2010 +
                 (double)local_1b00._336_8_ * local_1f80;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[7] = (double)local_1b00._56_8_ * dStack_f88 + (double)local_1b00._200_8_ * dStack_2008 +
                 (double)local_1b00._344_8_ * dStack_1f78;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[8] = (double)local_1b00._64_8_ * local_f80 + (double)local_1b00._208_8_ * local_2000 +
                 (double)local_1b00._352_8_ * local_1f70;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[9] = (double)local_1b00._72_8_ * dStack_f78 + (double)local_1b00._216_8_ * dStack_1ff8 +
                 (double)local_1b00._360_8_ * dStack_1f68;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[10] = (double)local_1b00._80_8_ * local_f70 + (double)local_1b00._224_8_ * local_1ff0 +
                  (double)local_1b00._368_8_ * local_1f60;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xb] = (double)local_1b00._88_8_ * dStack_f68 + (double)local_1b00._232_8_ * dStack_1fe8
                   + (double)local_1b00._376_8_ * dStack_1f58;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xc] = (double)local_1b00._96_8_ * local_f60 + (double)local_1b00._240_8_ * local_1fe0 +
                   (double)local_1b00._384_8_ * local_1f50;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xd] = (double)local_1b00._104_8_ * dStack_f58 +
                   (double)local_1b00._248_8_ * dStack_1fd8 +
                   (double)local_1b00._392_8_ * dStack_1f48;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xe] = (double)local_1b00._112_8_ * local_f50 + (double)local_1b00._256_8_ * local_1fd0
                   + (double)local_1b00._400_8_ * local_1f40;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xf] = (double)local_1b00._120_8_ * dStack_f48 +
                   (double)local_1b00._264_8_ * dStack_1fc8 +
                   (double)local_1b00._408_8_ * dStack_1f38;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x10] = (double)local_1b00._128_8_ * local_f40 + (double)local_1b00._272_8_ * local_1fc0
                    + (double)local_1b00._416_8_ * local_1f30;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x11] = (double)local_1b00._136_8_ * dStack_f38 +
                    (double)local_1b00._280_8_ * dStack_1fb8 +
                    (double)local_1b00._424_8_ * dStack_1f28;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x36] = (double)local_1b00._432_8_ * local_fc0 + (double)local_1b00._576_8_ * local_2040
                    + (double)local_1b00._720_8_ * local_1fb0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x37] = (double)local_1b00._440_8_ * dStack_fb8 +
                    (double)local_1b00._584_8_ * dStack_2038 +
                    (double)local_1b00._728_8_ * dStack_1fa8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x38] = (double)local_1b00._448_8_ * local_fb0[0] +
                    (double)local_1b00._592_8_ * local_2030[0] +
                    (double)local_1b00._736_8_ * local_1fa0[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x39] = (double)local_1b00._456_8_ * local_fb0[1] +
                    (double)local_1b00._600_8_ * local_2030[1] +
                    (double)local_1b00._744_8_ * local_1fa0[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3a] = (double)local_1b00._464_8_ * local_fb0[2] +
                    (double)local_1b00._608_8_ * local_2030[2] +
                    (double)local_1b00._752_8_ * local_1fa0[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3b] = (double)local_1b00._472_8_ * local_fb0[3] +
                    (double)local_1b00._616_8_ * local_2030[3] +
                    (double)local_1b00._760_8_ * local_1fa0[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3c] = (double)local_1b00._480_8_ * local_f90 + (double)local_1b00._624_8_ * local_2010
                    + (double)local_1b00._768_8_ * local_1f80;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3d] = (double)local_1b00._488_8_ * dStack_f88 +
                    (double)local_1b00._632_8_ * dStack_2008 +
                    (double)local_1b00._776_8_ * dStack_1f78;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3e] = (double)local_1b00._496_8_ * local_f80 + (double)local_1b00._640_8_ * local_2000
                    + (double)local_1b00._784_8_ * local_1f70;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3f] = (double)local_1b00._504_8_ * dStack_f78 +
                    (double)local_1b00._648_8_ * dStack_1ff8 +
                    (double)local_1b00._792_8_ * dStack_1f68;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x40] = (double)local_1b00._512_8_ * local_f70 + (double)local_1b00._656_8_ * local_1ff0
                    + (double)local_1b00._800_8_ * local_1f60;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x41] = (double)local_1b00._520_8_ * dStack_f68 +
                    (double)local_1b00._664_8_ * dStack_1fe8 +
                    (double)local_1b00._808_8_ * dStack_1f58;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x42] = (double)local_1b00._528_8_ * local_f60 + (double)local_1b00._672_8_ * local_1fe0
                    + (double)local_1b00._816_8_ * local_1f50;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x43] = (double)local_1b00._536_8_ * dStack_f58 +
                    (double)local_1b00._680_8_ * dStack_1fd8 +
                    (double)local_1b00._824_8_ * dStack_1f48;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x44] = (double)local_1b00._544_8_ * local_f50 + (double)local_1b00._688_8_ * local_1fd0
                    + (double)local_1b00._832_8_ * local_1f40;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x45] = (double)local_1b00._552_8_ * dStack_f48 +
                    (double)local_1b00._696_8_ * dStack_1fc8 +
                    (double)local_1b00._840_8_ * dStack_1f38;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x46] = (double)local_1b00._560_8_ * local_f40 + (double)local_1b00._704_8_ * local_1fc0
                    + (double)local_1b00._848_8_ * local_1f30;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x47] = (double)local_1b00._568_8_ * dStack_f38 +
                    (double)local_1b00._712_8_ * dStack_1fb8 +
                    (double)local_1b00._856_8_ * dStack_1f28;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6c] = (double)local_1b00._864_8_ * local_fc0 +
                    (double)local_1b00._1008_8_ * local_2040 +
                    (double)local_1b00._1152_8_ * local_1fb0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6d] = (double)local_1b00._872_8_ * dStack_fb8 +
                    (double)local_1b00._1016_8_ * dStack_2038 +
                    (double)local_1b00._1160_8_ * dStack_1fa8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6e] = (double)local_1b00._880_8_ * local_fb0[0] +
                    (double)local_1b00._1024_8_ * local_2030[0] +
                    (double)local_1b00._1168_8_ * local_1fa0[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6f] = (double)local_1b00._888_8_ * local_fb0[1] +
                    (double)local_1b00._1032_8_ * local_2030[1] +
                    (double)local_1b00._1176_8_ * local_1fa0[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x70] = (double)local_1b00._896_8_ * local_fb0[2] +
                    (double)local_1b00._1040_8_ * local_2030[2] +
                    (double)local_1b00._1184_8_ * local_1fa0[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x71] = (double)local_1b00._904_8_ * local_fb0[3] +
                    (double)local_1b00._1048_8_ * local_2030[3] +
                    (double)local_1b00._1192_8_ * local_1fa0[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x72] = (double)local_1b00._912_8_ * local_f90 +
                    (double)local_1b00._1056_8_ * local_2010 +
                    (double)local_1b00._1200_8_ * local_1f80;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x73] = (double)local_1b00._920_8_ * dStack_f88 +
                    (double)local_1b00._1064_8_ * dStack_2008 +
                    (double)local_1b00._1208_8_ * dStack_1f78;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x74] = (double)local_1b00._928_8_ * local_f80 +
                    (double)local_1b00._1072_8_ * local_2000 +
                    (double)local_1b00._1216_8_ * local_1f70;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x75] = (double)local_1b00._936_8_ * dStack_f78 +
                    (double)local_1b00._1080_8_ * dStack_1ff8 +
                    (double)local_1b00._1224_8_ * dStack_1f68;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x76] = (double)local_1b00._944_8_ * local_f70 +
                    (double)local_1b00._1088_8_ * local_1ff0 +
                    (double)local_1b00._1232_8_ * local_1f60;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x77] = (double)local_1b00._952_8_ * dStack_f68 +
                    (double)local_1b00._1096_8_ * dStack_1fe8 +
                    (double)local_1b00._1240_8_ * dStack_1f58;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x78] = (double)local_1b00._960_8_ * local_f60 +
                    (double)local_1b00._1104_8_ * local_1fe0 +
                    (double)local_1b00._1248_8_ * local_1f50;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x79] = (double)local_1b00._968_8_ * dStack_f58 +
                    (double)local_1b00._1112_8_ * dStack_1fd8 +
                    (double)local_1b00._1256_8_ * dStack_1f48;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7a] = (double)local_1b00._976_8_ * local_f50 +
                    (double)local_1b00._1120_8_ * local_1fd0 +
                    (double)local_1b00._1264_8_ * local_1f40;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7b] = (double)local_1b00._984_8_ * dStack_f48 +
                    (double)local_1b00._1128_8_ * dStack_1fc8 +
                    (double)local_1b00._1272_8_ * dStack_1f38;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7c] = (double)local_1b00._992_8_ * local_f40 +
                    (double)local_1b00._1136_8_ * local_1fc0 +
                    (double)local_1b00._1280_8_ * local_1f30;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7d] = (double)local_1b00._1000_8_ * dStack_f38 +
                    (double)local_1b00._1144_8_ * dStack_1fb8 +
                    (double)local_1b00._1288_8_ * dStack_1f28;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x12] = (double)local_1b00._0_8_ * local_2040 + (double)local_1b00._144_8_ * local_1050
                    + (double)local_1b00._288_8_ * local_1f20;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x13] = (double)local_1b00._8_8_ * dStack_2038 +
                    (double)local_1b00._152_8_ * dStack_1048 +
                    (double)local_1b00._296_8_ * dStack_1f18;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x14] = (double)local_1b00._16_8_ * local_2030[0] +
                    (double)local_1b00._160_8_ * local_1040[0] +
                    (double)local_1b00._304_8_ * local_1f10[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x15] = (double)local_1b00._24_8_ * local_2030[1] +
                    (double)local_1b00._168_8_ * local_1040[1] +
                    (double)local_1b00._312_8_ * local_1f10[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x16] = (double)local_1b00._32_8_ * local_2030[2] +
                    (double)local_1b00._176_8_ * local_1040[2] +
                    (double)local_1b00._320_8_ * local_1f10[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x17] = (double)local_1b00._40_8_ * local_2030[3] +
                    (double)local_1b00._184_8_ * local_1040[3] +
                    (double)local_1b00._328_8_ * local_1f10[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x18] = (double)local_1b00._48_8_ * local_2010 + (double)local_1b00._192_8_ * local_1020
                    + (double)local_1b00._336_8_ * local_1ef0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x19] = (double)local_1b00._56_8_ * dStack_2008 +
                    (double)local_1b00._200_8_ * dStack_1018 +
                    (double)local_1b00._344_8_ * dStack_1ee8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1a] = (double)local_1b00._64_8_ * local_2000 + (double)local_1b00._208_8_ * local_1010
                    + (double)local_1b00._352_8_ * local_1ee0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1b] = (double)local_1b00._72_8_ * dStack_1ff8 +
                    (double)local_1b00._216_8_ * dStack_1008 +
                    (double)local_1b00._360_8_ * dStack_1ed8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1c] = (double)local_1b00._80_8_ * local_1ff0 + (double)local_1b00._224_8_ * local_1000
                    + (double)local_1b00._368_8_ * local_1ed0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1d] = (double)local_1b00._88_8_ * dStack_1fe8 +
                    (double)local_1b00._232_8_ * dStack_ff8 +
                    (double)local_1b00._376_8_ * dStack_1ec8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1e] = (double)local_1b00._96_8_ * local_1fe0 + (double)local_1b00._240_8_ * local_ff0
                    + (double)local_1b00._384_8_ * local_1ec0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1f] = (double)local_1b00._104_8_ * dStack_1fd8 +
                    (double)local_1b00._248_8_ * dStack_fe8 +
                    (double)local_1b00._392_8_ * dStack_1eb8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x20] = (double)local_1b00._112_8_ * local_1fd0 + (double)local_1b00._256_8_ * local_fe0
                    + (double)local_1b00._400_8_ * local_1eb0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x21] = (double)local_1b00._120_8_ * dStack_1fc8 +
                    (double)local_1b00._264_8_ * dStack_fd8 +
                    (double)local_1b00._408_8_ * dStack_1ea8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x22] = (double)local_1b00._128_8_ * local_1fc0 + (double)local_1b00._272_8_ * local_fd0
                    + (double)local_1b00._416_8_ * local_1ea0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x23] = (double)local_1b00._136_8_ * dStack_1fb8 +
                    (double)local_1b00._280_8_ * dStack_fc8 +
                    (double)local_1b00._424_8_ * dStack_1e98;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x48] = (double)local_1b00._432_8_ * local_2040 +
                    (double)local_1b00._576_8_ * local_1050 +
                    (double)local_1b00._720_8_ * local_1f20;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x49] = (double)local_1b00._440_8_ * dStack_2038 +
                    (double)local_1b00._584_8_ * dStack_1048 +
                    (double)local_1b00._728_8_ * dStack_1f18;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4a] = (double)local_1b00._448_8_ * local_2030[0] +
                    (double)local_1b00._592_8_ * local_1040[0] +
                    (double)local_1b00._736_8_ * local_1f10[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4b] = (double)local_1b00._456_8_ * local_2030[1] +
                    (double)local_1b00._600_8_ * local_1040[1] +
                    (double)local_1b00._744_8_ * local_1f10[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4c] = (double)local_1b00._464_8_ * local_2030[2] +
                    (double)local_1b00._608_8_ * local_1040[2] +
                    (double)local_1b00._752_8_ * local_1f10[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4d] = (double)local_1b00._472_8_ * local_2030[3] +
                    (double)local_1b00._616_8_ * local_1040[3] +
                    (double)local_1b00._760_8_ * local_1f10[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4e] = (double)local_1b00._480_8_ * local_2010 +
                    (double)local_1b00._624_8_ * local_1020 +
                    (double)local_1b00._768_8_ * local_1ef0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4f] = (double)local_1b00._488_8_ * dStack_2008 +
                    (double)local_1b00._632_8_ * dStack_1018 +
                    (double)local_1b00._776_8_ * dStack_1ee8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x50] = (double)local_1b00._496_8_ * local_2000 +
                    (double)local_1b00._640_8_ * local_1010 +
                    (double)local_1b00._784_8_ * local_1ee0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x51] = (double)local_1b00._504_8_ * dStack_1ff8 +
                    (double)local_1b00._648_8_ * dStack_1008 +
                    (double)local_1b00._792_8_ * dStack_1ed8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x52] = (double)local_1b00._512_8_ * local_1ff0 +
                    (double)local_1b00._656_8_ * local_1000 +
                    (double)local_1b00._800_8_ * local_1ed0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x53] = (double)local_1b00._520_8_ * dStack_1fe8 +
                    (double)local_1b00._664_8_ * dStack_ff8 +
                    (double)local_1b00._808_8_ * dStack_1ec8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x54] = (double)local_1b00._528_8_ * local_1fe0 + (double)local_1b00._672_8_ * local_ff0
                    + (double)local_1b00._816_8_ * local_1ec0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x55] = (double)local_1b00._536_8_ * dStack_1fd8 +
                    (double)local_1b00._680_8_ * dStack_fe8 +
                    (double)local_1b00._824_8_ * dStack_1eb8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x56] = (double)local_1b00._544_8_ * local_1fd0 + (double)local_1b00._688_8_ * local_fe0
                    + (double)local_1b00._832_8_ * local_1eb0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x57] = (double)local_1b00._552_8_ * dStack_1fc8 +
                    (double)local_1b00._696_8_ * dStack_fd8 +
                    (double)local_1b00._840_8_ * dStack_1ea8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x58] = (double)local_1b00._560_8_ * local_1fc0 + (double)local_1b00._704_8_ * local_fd0
                    + (double)local_1b00._848_8_ * local_1ea0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x59] = (double)local_1b00._568_8_ * dStack_1fb8 +
                    (double)local_1b00._712_8_ * dStack_fc8 +
                    (double)local_1b00._856_8_ * dStack_1e98;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7e] = (double)local_1b00._864_8_ * local_2040 +
                    (double)local_1b00._1008_8_ * local_1050 +
                    (double)local_1b00._1152_8_ * local_1f20;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7f] = (double)local_1b00._872_8_ * dStack_2038 +
                    (double)local_1b00._1016_8_ * dStack_1048 +
                    (double)local_1b00._1160_8_ * dStack_1f18;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x80] = (double)local_1b00._880_8_ * local_2030[0] +
                    (double)local_1b00._1024_8_ * local_1040[0] +
                    (double)local_1b00._1168_8_ * local_1f10[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x81] = (double)local_1b00._888_8_ * local_2030[1] +
                    (double)local_1b00._1032_8_ * local_1040[1] +
                    (double)local_1b00._1176_8_ * local_1f10[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x82] = (double)local_1b00._896_8_ * local_2030[2] +
                    (double)local_1b00._1040_8_ * local_1040[2] +
                    (double)local_1b00._1184_8_ * local_1f10[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x83] = (double)local_1b00._904_8_ * local_2030[3] +
                    (double)local_1b00._1048_8_ * local_1040[3] +
                    (double)local_1b00._1192_8_ * local_1f10[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x84] = (double)local_1b00._912_8_ * local_2010 +
                    (double)local_1b00._1056_8_ * local_1020 +
                    (double)local_1b00._1200_8_ * local_1ef0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x85] = (double)local_1b00._920_8_ * dStack_2008 +
                    (double)local_1b00._1064_8_ * dStack_1018 +
                    (double)local_1b00._1208_8_ * dStack_1ee8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x86] = (double)local_1b00._928_8_ * local_2000 +
                    (double)local_1b00._1072_8_ * local_1010 +
                    (double)local_1b00._1216_8_ * local_1ee0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x87] = (double)local_1b00._936_8_ * dStack_1ff8 +
                    (double)local_1b00._1080_8_ * dStack_1008 +
                    (double)local_1b00._1224_8_ * dStack_1ed8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x88] = (double)local_1b00._944_8_ * local_1ff0 +
                    (double)local_1b00._1088_8_ * local_1000 +
                    (double)local_1b00._1232_8_ * local_1ed0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x89] = (double)local_1b00._952_8_ * dStack_1fe8 +
                    (double)local_1b00._1096_8_ * dStack_ff8 +
                    (double)local_1b00._1240_8_ * dStack_1ec8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8a] = (double)local_1b00._960_8_ * local_1fe0 +
                    (double)local_1b00._1104_8_ * local_ff0 +
                    (double)local_1b00._1248_8_ * local_1ec0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8b] = (double)local_1b00._968_8_ * dStack_1fd8 +
                    (double)local_1b00._1112_8_ * dStack_fe8 +
                    (double)local_1b00._1256_8_ * dStack_1eb8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8c] = (double)local_1b00._976_8_ * local_1fd0 +
                    (double)local_1b00._1120_8_ * local_fe0 +
                    (double)local_1b00._1264_8_ * local_1eb0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8d] = (double)local_1b00._984_8_ * dStack_1fc8 +
                    (double)local_1b00._1128_8_ * dStack_fd8 +
                    (double)local_1b00._1272_8_ * dStack_1ea8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8e] = (double)local_1b00._992_8_ * local_1fc0 +
                    (double)local_1b00._1136_8_ * local_fd0 +
                    (double)local_1b00._1280_8_ * local_1ea0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8f] = (double)local_1b00._1000_8_ * dStack_1fb8 +
                    (double)local_1b00._1144_8_ * dStack_fc8 +
                    (double)local_1b00._1288_8_ * dStack_1e98;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x24] = (double)local_1b00._0_8_ * local_1fb0 + (double)local_1b00._144_8_ * local_1f20
                    + (double)local_1b00._288_8_ * local_10e0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x25] = (double)local_1b00._8_8_ * dStack_1fa8 +
                    (double)local_1b00._152_8_ * dStack_1f18 +
                    (double)local_1b00._296_8_ * dStack_10d8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x26] = (double)local_1b00._16_8_ * local_1fa0[0] +
                    (double)local_1b00._160_8_ * local_1f10[0] +
                    (double)local_1b00._304_8_ * local_10d0[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x27] = (double)local_1b00._24_8_ * local_1fa0[1] +
                    (double)local_1b00._168_8_ * local_1f10[1] +
                    (double)local_1b00._312_8_ * local_10d0[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x28] = (double)local_1b00._32_8_ * local_1fa0[2] +
                    (double)local_1b00._176_8_ * local_1f10[2] +
                    (double)local_1b00._320_8_ * local_10d0[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x29] = (double)local_1b00._40_8_ * local_1fa0[3] +
                    (double)local_1b00._184_8_ * local_1f10[3] +
                    (double)local_1b00._328_8_ * local_10d0[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2a] = (double)local_1b00._48_8_ * local_1f80 + (double)local_1b00._192_8_ * local_1ef0
                    + (double)local_1b00._336_8_ * local_10b0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2b] = (double)local_1b00._56_8_ * dStack_1f78 +
                    (double)local_1b00._200_8_ * dStack_1ee8 +
                    (double)local_1b00._344_8_ * dStack_10a8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2c] = (double)local_1b00._64_8_ * local_1f70 + (double)local_1b00._208_8_ * local_1ee0
                    + (double)local_1b00._352_8_ * local_10a0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2d] = (double)local_1b00._72_8_ * dStack_1f68 +
                    (double)local_1b00._216_8_ * dStack_1ed8 +
                    (double)local_1b00._360_8_ * dStack_1098;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2e] = (double)local_1b00._80_8_ * local_1f60 + (double)local_1b00._224_8_ * local_1ed0
                    + (double)local_1b00._368_8_ * local_1090;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2f] = (double)local_1b00._88_8_ * dStack_1f58 +
                    (double)local_1b00._232_8_ * dStack_1ec8 +
                    (double)local_1b00._376_8_ * dStack_1088;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x30] = (double)local_1b00._96_8_ * local_1f50 + (double)local_1b00._240_8_ * local_1ec0
                    + (double)local_1b00._384_8_ * local_1080;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x31] = (double)local_1b00._104_8_ * dStack_1f48 +
                    (double)local_1b00._248_8_ * dStack_1eb8 +
                    (double)local_1b00._392_8_ * dStack_1078;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x32] = (double)local_1b00._112_8_ * local_1f40 +
                    (double)local_1b00._256_8_ * local_1eb0 +
                    (double)local_1b00._400_8_ * local_1070;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x33] = (double)local_1b00._120_8_ * dStack_1f38 +
                    (double)local_1b00._264_8_ * dStack_1ea8 +
                    (double)local_1b00._408_8_ * dStack_1068;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x34] = (double)local_1b00._128_8_ * local_1f30 +
                    (double)local_1b00._272_8_ * local_1ea0 +
                    (double)local_1b00._416_8_ * local_1060;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x35] = (double)local_1b00._136_8_ * dStack_1f28 +
                    (double)local_1b00._280_8_ * dStack_1e98 +
                    (double)local_1b00._424_8_ * dStack_1058;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5a] = (double)local_1b00._432_8_ * local_1fb0 +
                    (double)local_1b00._576_8_ * local_1f20 +
                    (double)local_1b00._720_8_ * local_10e0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5b] = (double)local_1b00._440_8_ * dStack_1fa8 +
                    (double)local_1b00._584_8_ * dStack_1f18 +
                    (double)local_1b00._728_8_ * dStack_10d8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5c] = (double)local_1b00._448_8_ * local_1fa0[0] +
                    (double)local_1b00._592_8_ * local_1f10[0] +
                    (double)local_1b00._736_8_ * local_10d0[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5d] = (double)local_1b00._456_8_ * local_1fa0[1] +
                    (double)local_1b00._600_8_ * local_1f10[1] +
                    (double)local_1b00._744_8_ * local_10d0[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5e] = (double)local_1b00._464_8_ * local_1fa0[2] +
                    (double)local_1b00._608_8_ * local_1f10[2] +
                    (double)local_1b00._752_8_ * local_10d0[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5f] = (double)local_1b00._472_8_ * local_1fa0[3] +
                    (double)local_1b00._616_8_ * local_1f10[3] +
                    (double)local_1b00._760_8_ * local_10d0[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x60] = (double)local_1b00._480_8_ * local_1f80 +
                    (double)local_1b00._624_8_ * local_1ef0 +
                    (double)local_1b00._768_8_ * local_10b0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x61] = (double)local_1b00._488_8_ * dStack_1f78 +
                    (double)local_1b00._632_8_ * dStack_1ee8 +
                    (double)local_1b00._776_8_ * dStack_10a8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x62] = (double)local_1b00._496_8_ * local_1f70 +
                    (double)local_1b00._640_8_ * local_1ee0 +
                    (double)local_1b00._784_8_ * local_10a0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[99] = (double)local_1b00._504_8_ * dStack_1f68 +
                  (double)local_1b00._648_8_ * dStack_1ed8 +
                  (double)local_1b00._792_8_ * dStack_1098;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[100] = (double)local_1b00._512_8_ * local_1f60 + (double)local_1b00._656_8_ * local_1ed0
                   + (double)local_1b00._800_8_ * local_1090;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x65] = (double)local_1b00._520_8_ * dStack_1f58 +
                    (double)local_1b00._664_8_ * dStack_1ec8 +
                    (double)local_1b00._808_8_ * dStack_1088;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x66] = (double)local_1b00._528_8_ * local_1f50 +
                    (double)local_1b00._672_8_ * local_1ec0 +
                    (double)local_1b00._816_8_ * local_1080;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x67] = (double)local_1b00._536_8_ * dStack_1f48 +
                    (double)local_1b00._680_8_ * dStack_1eb8 +
                    (double)local_1b00._824_8_ * dStack_1078;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x68] = (double)local_1b00._544_8_ * local_1f40 +
                    (double)local_1b00._688_8_ * local_1eb0 +
                    (double)local_1b00._832_8_ * local_1070;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x69] = (double)local_1b00._552_8_ * dStack_1f38 +
                    (double)local_1b00._696_8_ * dStack_1ea8 +
                    (double)local_1b00._840_8_ * dStack_1068;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6a] = (double)local_1b00._560_8_ * local_1f30 +
                    (double)local_1b00._704_8_ * local_1ea0 +
                    (double)local_1b00._848_8_ * local_1060;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6b] = (double)local_1b00._568_8_ * dStack_1f28 +
                    (double)local_1b00._712_8_ * dStack_1e98 +
                    (double)local_1b00._856_8_ * dStack_1058;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x90] = (double)local_1b00._864_8_ * local_1fb0 +
                    (double)local_1b00._1008_8_ * local_1f20 +
                    (double)local_1b00._1152_8_ * local_10e0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x91] = (double)local_1b00._872_8_ * dStack_1fa8 +
                    (double)local_1b00._1016_8_ * dStack_1f18 +
                    (double)local_1b00._1160_8_ * dStack_10d8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x92] = (double)local_1b00._880_8_ * local_1fa0[0] +
                    (double)local_1b00._1024_8_ * local_1f10[0] +
                    (double)local_1b00._1168_8_ * local_10d0[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x93] = (double)local_1b00._888_8_ * local_1fa0[1] +
                    (double)local_1b00._1032_8_ * local_1f10[1] +
                    (double)local_1b00._1176_8_ * local_10d0[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x94] = (double)local_1b00._896_8_ * local_1fa0[2] +
                    (double)local_1b00._1040_8_ * local_1f10[2] +
                    (double)local_1b00._1184_8_ * local_10d0[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x95] = (double)local_1b00._904_8_ * local_1fa0[3] +
                    (double)local_1b00._1048_8_ * local_1f10[3] +
                    (double)local_1b00._1192_8_ * local_10d0[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x96] = (double)local_1b00._912_8_ * local_1f80 +
                    (double)local_1b00._1056_8_ * local_1ef0 +
                    (double)local_1b00._1200_8_ * local_10b0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x97] = (double)local_1b00._920_8_ * dStack_1f78 +
                    (double)local_1b00._1064_8_ * dStack_1ee8 +
                    (double)local_1b00._1208_8_ * dStack_10a8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x98] = (double)local_1b00._928_8_ * local_1f70 +
                    (double)local_1b00._1072_8_ * local_1ee0 +
                    (double)local_1b00._1216_8_ * local_10a0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x99] = (double)local_1b00._936_8_ * dStack_1f68 +
                    (double)local_1b00._1080_8_ * dStack_1ed8 +
                    (double)local_1b00._1224_8_ * dStack_1098;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9a] = (double)local_1b00._944_8_ * local_1f60 +
                    (double)local_1b00._1088_8_ * local_1ed0 +
                    (double)local_1b00._1232_8_ * local_1090;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9b] = (double)local_1b00._952_8_ * dStack_1f58 +
                    (double)local_1b00._1096_8_ * dStack_1ec8 +
                    (double)local_1b00._1240_8_ * dStack_1088;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9c] = (double)local_1b00._960_8_ * local_1f50 +
                    (double)local_1b00._1104_8_ * local_1ec0 +
                    (double)local_1b00._1248_8_ * local_1080;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9d] = (double)local_1b00._968_8_ * dStack_1f48 +
                    (double)local_1b00._1112_8_ * dStack_1eb8 +
                    (double)local_1b00._1256_8_ * dStack_1078;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9e] = (double)local_1b00._976_8_ * local_1f40 +
                    (double)local_1b00._1120_8_ * local_1eb0 +
                    (double)local_1b00._1264_8_ * local_1070;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9f] = (double)local_1b00._984_8_ * dStack_1f38 +
                    (double)local_1b00._1128_8_ * dStack_1ea8 +
                    (double)local_1b00._1272_8_ * dStack_1068;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xa0] = (double)local_1b00._992_8_ * local_1f30 +
                    (double)local_1b00._1136_8_ * local_1ea0 +
                    (double)local_1b00._1280_8_ * local_1060;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xa1] = (double)local_1b00._1000_8_ * dStack_1f28 +
                    (double)local_1b00._1144_8_ * dStack_1e98 +
                    (double)local_1b00._1288_8_ * dStack_1058;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows < 0x18) ||
         (dVar144 = (double)(this->m_SD).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_cols, (long)dVar144 < local_1d58)) goto LAB_00761cf2;
      local_c88.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false>,_0>.m_data
           = (PointerType)
             (local_1d60 +
             (long)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data);
      local_c88.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_true>.
      m_startRow.m_value = 0;
      local_c88.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_true>.
      m_startCol.m_value = (long)dVar115;
      local_c58 = &local_c50;
      local_1d48 = 1.0;
      local_c88.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_true>.m_xpr =
           &this->m_SD;
      local_c88.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false,_true>.
      m_outerStride = (Index)dVar144;
      Eigen::internal::
      generic_product_impl<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,24,54,false>,Eigen::Matrix<double,54,3,0,54,3>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,24,3,1,24,3>>
                (&local_740,&local_c88,local_c58,&local_1d48);
      uVar111 = local_1e88 + 1;
    } while (uVar111 < (ulong)(long)this->m_numLayers);
  }
  pCVar81 = local_1d68;
  if ((local_1d68->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      != 0x48) {
    pdVar114 = (local_1d68->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
    if (pdVar114 != (double *)0x0) {
      free((void *)pdVar114[-1]);
    }
    pvVar112 = malloc(0x280);
    if (pvVar112 == (void *)0x0) {
      pdVar114 = (double *)0x0;
    }
    else {
      *(void **)(((ulong)pvVar112 & 0xffffffffffffffc0) + 0x38) = pvVar112;
      pdVar114 = (double *)(((ulong)pvVar112 & 0xffffffffffffffc0) + 0x40);
    }
    if (pdVar114 == (double *)0x0) {
      puVar113 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar113 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar113,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (pCVar81->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar114;
    (pCVar81->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
         0x48;
  }
  if ((pCVar81->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      0x48) {
    pdVar114 = (pCVar81->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
    uVar111 = 0xfffffffffffffff8;
    do {
      dVar115 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
                m_data.array[uVar111 + 9];
      dVar144 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
                m_data.array[uVar111 + 10];
      dVar3 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
              m_data.array[uVar111 + 0xb];
      dVar6 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
              m_data.array[uVar111 + 0xc];
      dVar7 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
              m_data.array[uVar111 + 0xd];
      dVar8 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
              m_data.array[uVar111 + 0xe];
      dVar9 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
              m_data.array[uVar111 + 0xf];
      pdVar2 = pdVar114 + uVar111 + 8;
      *pdVar2 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
                m_data.array[uVar111 + 8];
      pdVar2[1] = dVar115;
      pdVar2[2] = dVar144;
      pdVar2[3] = dVar3;
      pdVar2[4] = dVar6;
      pdVar2[5] = dVar7;
      pdVar2[6] = dVar8;
      pdVar2[7] = dVar9;
      uVar111 = uVar111 + 8;
    } while (uVar111 < 0x40);
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 72, 1>>, T1 = double, T2 = double]"
               );
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For a small number of layers this method can be more efficient than the "Pre-Integration" style calculation
    // method.  Note that the integrand for the generalize internal force vector for a straight and normalized element
    // is of order : 8 in xi, 8 in eta, and 8 in zeta. This requires GQ 5 points along the xi and eta directions and 5
    // points along zeta direction for "Full Integration". However, very similar results can be obtained with fewer GQ
    // point in each direction, resulting in significantly fewer calculations.  Based on testing, this could be as low
    // as 3x3x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    MatrixNx3 QiCompact;
    QiCompact.setZero();

    // Loop over all of the layers summing the contribution to the generalized internal force vector from each layer
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
        // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
        // this element compared to what is used in ChMaterialShellANCF
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
        // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
        // The entries are grouped by component in block matrices (column vectors)
        // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
        //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ]
        //         = [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ]
        //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> P_Block;

        P_Block.template block<NIP, 1>(0, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_5_Block);

        P_Block.template block<NIP, 1>(NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_4_Block);

        P_Block.template block<NIP, 1>(2 * NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_3_Block);

        // =============================================================================
        // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix for the current
        // layer to get the generalized force vector in matrix form (in the correct order if its calculated in row-major
        // memory layout)
        // =============================================================================

        QiCompact.noalias() += m_SD.block<NSF, 3 * NIP>(0, 3 * kl * NIP) * P_Block;
    }

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}